

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  int iVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  byte bVar66;
  ulong uVar67;
  uint uVar68;
  uint uVar69;
  Geometry *pGVar70;
  RayQueryContext *pRVar71;
  long lVar72;
  uint uVar73;
  long lVar74;
  ulong uVar75;
  byte bVar76;
  ulong uVar77;
  float fVar78;
  float fVar79;
  float fVar130;
  float fVar132;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar89 [16];
  float fVar131;
  float fVar133;
  float fVar135;
  float fVar136;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar134;
  float fVar137;
  float fVar138;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined4 uVar139;
  float fVar149;
  float fVar150;
  vint4 bi_2;
  float fVar151;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined8 uVar152;
  vint4 bi_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  float fVar161;
  float fVar175;
  vint4 bi;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  vint4 ai_2;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  vint4 ai_1;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  vint4 ai;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [16];
  float fVar206;
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_53c;
  RayQueryContext *local_538;
  ulong local_530;
  ulong local_528;
  Primitive *local_520;
  Precalculations *local_518;
  RTCFilterFunctionNArguments local_510;
  undefined1 local_4e0 [8];
  undefined8 uStack_4d8;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined8 local_4a0;
  undefined4 local_498;
  float local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  uint local_484;
  uint local_480;
  Geometry *local_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar7 = prim[1];
  uVar67 = (ulong)(byte)PVar7;
  lVar27 = uVar67 * 0x25;
  fVar161 = *(float *)(prim + lVar27 + 0x12);
  auVar85 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar27 + 6));
  auVar162._0_4_ = fVar161 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar162._4_4_ = fVar161 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar162._8_4_ = fVar161 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar162._12_4_ = fVar161 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 4 + 6)));
  auVar184._0_4_ = fVar161 * auVar85._0_4_;
  auVar184._4_4_ = fVar161 * auVar85._4_4_;
  auVar184._8_4_ = fVar161 * auVar85._8_4_;
  auVar184._12_4_ = fVar161 * auVar85._12_4_;
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 5 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 6 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xf + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar67 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1a + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1b + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1c + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar191._4_4_ = auVar162._0_4_;
  auVar191._0_4_ = auVar162._0_4_;
  auVar191._8_4_ = auVar162._0_4_;
  auVar191._12_4_ = auVar162._0_4_;
  auVar22 = vshufps_avx(auVar162,auVar162,0x55);
  auVar23 = vshufps_avx(auVar162,auVar162,0xaa);
  fVar161 = auVar23._0_4_;
  auVar163._0_4_ = fVar161 * auVar81._0_4_;
  fVar149 = auVar23._4_4_;
  auVar163._4_4_ = fVar149 * auVar81._4_4_;
  fVar150 = auVar23._8_4_;
  auVar163._8_4_ = fVar150 * auVar81._8_4_;
  fVar151 = auVar23._12_4_;
  auVar163._12_4_ = fVar151 * auVar81._12_4_;
  auVar153._0_4_ = auVar82._0_4_ * fVar161;
  auVar153._4_4_ = auVar82._4_4_ * fVar149;
  auVar153._8_4_ = auVar82._8_4_ * fVar150;
  auVar153._12_4_ = auVar82._12_4_ * fVar151;
  auVar89._0_4_ = auVar83._0_4_ * fVar161;
  auVar89._4_4_ = auVar83._4_4_ * fVar149;
  auVar89._8_4_ = auVar83._8_4_ * fVar150;
  auVar89._12_4_ = auVar83._12_4_ * fVar151;
  auVar23 = vfmadd231ps_fma(auVar163,auVar22,auVar85);
  auVar28 = vfmadd231ps_fma(auVar153,auVar22,auVar19);
  auVar22 = vfmadd231ps_fma(auVar89,auVar21,auVar22);
  auVar23 = vfmadd231ps_fma(auVar23,auVar191,auVar84);
  auVar28 = vfmadd231ps_fma(auVar28,auVar191,auVar18);
  auVar29 = vfmadd231ps_fma(auVar22,auVar20,auVar191);
  auVar213._4_4_ = auVar184._0_4_;
  auVar213._0_4_ = auVar184._0_4_;
  auVar213._8_4_ = auVar184._0_4_;
  auVar213._12_4_ = auVar184._0_4_;
  auVar22 = vshufps_avx(auVar184,auVar184,0x55);
  auVar80 = vshufps_avx512vl(auVar184,auVar184,0xaa);
  auVar81 = vmulps_avx512vl(auVar80,auVar81);
  auVar82 = vmulps_avx512vl(auVar80,auVar82);
  auVar83 = vmulps_avx512vl(auVar80,auVar83);
  auVar85 = vfmadd231ps_fma(auVar81,auVar22,auVar85);
  auVar81 = vfmadd231ps_fma(auVar82,auVar22,auVar19);
  auVar19 = vfmadd231ps_fma(auVar83,auVar22,auVar21);
  auVar30 = vfmadd231ps_fma(auVar85,auVar213,auVar84);
  auVar89 = vfmadd231ps_fma(auVar81,auVar213,auVar18);
  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar218 = ZEXT1664(auVar84);
  auVar140 = vfmadd231ps_fma(auVar19,auVar213,auVar20);
  auVar85 = vandps_avx512vl(auVar23,auVar84);
  auVar201._8_4_ = 0x219392ef;
  auVar201._0_8_ = 0x219392ef219392ef;
  auVar201._12_4_ = 0x219392ef;
  uVar75 = vcmpps_avx512vl(auVar85,auVar201,1);
  bVar12 = (bool)((byte)uVar75 & 1);
  auVar86._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar23._0_4_;
  bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar23._4_4_;
  bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar23._8_4_;
  bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar23._12_4_;
  auVar85 = vandps_avx512vl(auVar28,auVar84);
  uVar75 = vcmpps_avx512vl(auVar85,auVar201,1);
  bVar12 = (bool)((byte)uVar75 & 1);
  auVar87._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._0_4_;
  bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._4_4_;
  bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._8_4_;
  bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._12_4_;
  auVar84 = vandps_avx512vl(auVar29,auVar84);
  uVar75 = vcmpps_avx512vl(auVar84,auVar201,1);
  bVar12 = (bool)((byte)uVar75 & 1);
  auVar88._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar29._0_4_;
  bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar29._4_4_;
  bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar29._8_4_;
  bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar29._12_4_;
  auVar85 = vrcp14ps_avx512vl(auVar86);
  auVar202._8_4_ = 0x3f800000;
  auVar202._0_8_ = 0x3f8000003f800000;
  auVar202._12_4_ = 0x3f800000;
  auVar84 = vfnmadd213ps_fma(auVar86,auVar85,auVar202);
  auVar29 = vfmadd132ps_fma(auVar84,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar87);
  auVar84 = vfnmadd213ps_fma(auVar87,auVar85,auVar202);
  auVar80 = vfmadd132ps_fma(auVar84,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar88);
  auVar84 = vfnmadd213ps_fma(auVar88,auVar85,auVar202);
  auVar217 = vfmadd132ps_fma(auVar84,auVar85,auVar85);
  fVar161 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar27 + 0x16)) *
            *(float *)(prim + lVar27 + 0x1a);
  auVar199._4_4_ = fVar161;
  auVar199._0_4_ = fVar161;
  auVar199._8_4_ = fVar161;
  auVar199._12_4_ = fVar161;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar67 * 7 + 6);
  auVar84 = vpmovsxwd_avx(auVar84);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar67 * 0xb + 6);
  auVar85 = vpmovsxwd_avx(auVar85);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar18 = vsubps_avx(auVar85,auVar84);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar67 * 9 + 6);
  auVar85 = vpmovsxwd_avx(auVar81);
  auVar81 = vfmadd213ps_fma(auVar18,auVar199,auVar84);
  auVar84 = vcvtdq2ps_avx(auVar85);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar67 * 0xd + 6);
  auVar85 = vpmovsxwd_avx(auVar18);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar84);
  auVar18 = vfmadd213ps_fma(auVar85,auVar199,auVar84);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar67 * 0x12 + 6);
  auVar84 = vpmovsxwd_avx(auVar19);
  auVar84 = vcvtdq2ps_avx(auVar84);
  uVar75 = (ulong)(uint)((int)(uVar67 * 5) << 2);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar67 * 2 + uVar75 + 6);
  auVar85 = vpmovsxwd_avx(auVar82);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar84);
  auVar19 = vfmadd213ps_fma(auVar85,auVar199,auVar84);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar75 + 6);
  auVar84 = vpmovsxwd_avx(auVar20);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar67 * 0x18 + 6);
  auVar85 = vpmovsxwd_avx(auVar21);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar84);
  auVar82 = vfmadd213ps_fma(auVar85,auVar199,auVar84);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar67 * 0x1d + 6);
  auVar84 = vpmovsxwd_avx(auVar83);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar67 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar85 = vpmovsxwd_avx(auVar22);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar84);
  auVar20 = vfmadd213ps_fma(auVar85,auVar199,auVar84);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar67) + 6);
  auVar84 = vpmovsxwd_avx(auVar23);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar67 * 0x23 + 6);
  auVar85 = vpmovsxwd_avx(auVar28);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar84);
  auVar85 = vfmadd213ps_fma(auVar85,auVar199,auVar84);
  auVar84 = vsubps_avx(auVar81,auVar30);
  auVar200._0_4_ = auVar29._0_4_ * auVar84._0_4_;
  auVar200._4_4_ = auVar29._4_4_ * auVar84._4_4_;
  auVar200._8_4_ = auVar29._8_4_ * auVar84._8_4_;
  auVar200._12_4_ = auVar29._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar18,auVar30);
  auVar164._0_4_ = auVar29._0_4_ * auVar84._0_4_;
  auVar164._4_4_ = auVar29._4_4_ * auVar84._4_4_;
  auVar164._8_4_ = auVar29._8_4_ * auVar84._8_4_;
  auVar164._12_4_ = auVar29._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar19,auVar89);
  auVar192._0_4_ = auVar80._0_4_ * auVar84._0_4_;
  auVar192._4_4_ = auVar80._4_4_ * auVar84._4_4_;
  auVar192._8_4_ = auVar80._8_4_ * auVar84._8_4_;
  auVar192._12_4_ = auVar80._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar82,auVar89);
  auVar154._0_4_ = auVar80._0_4_ * auVar84._0_4_;
  auVar154._4_4_ = auVar80._4_4_ * auVar84._4_4_;
  auVar154._8_4_ = auVar80._8_4_ * auVar84._8_4_;
  auVar154._12_4_ = auVar80._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar20,auVar140);
  auVar185._0_4_ = auVar217._0_4_ * auVar84._0_4_;
  auVar185._4_4_ = auVar217._4_4_ * auVar84._4_4_;
  auVar185._8_4_ = auVar217._8_4_ * auVar84._8_4_;
  auVar185._12_4_ = auVar217._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar85,auVar140);
  auVar140._0_4_ = auVar217._0_4_ * auVar84._0_4_;
  auVar140._4_4_ = auVar217._4_4_ * auVar84._4_4_;
  auVar140._8_4_ = auVar217._8_4_ * auVar84._8_4_;
  auVar140._12_4_ = auVar217._12_4_ * auVar84._12_4_;
  auVar84 = vpminsd_avx(auVar200,auVar164);
  auVar85 = vpminsd_avx(auVar192,auVar154);
  auVar84 = vmaxps_avx(auVar84,auVar85);
  auVar85 = vpminsd_avx(auVar185,auVar140);
  uVar139 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar29._4_4_ = uVar139;
  auVar29._0_4_ = uVar139;
  auVar29._8_4_ = uVar139;
  auVar29._12_4_ = uVar139;
  auVar85 = vmaxps_avx512vl(auVar85,auVar29);
  auVar84 = vmaxps_avx(auVar84,auVar85);
  auVar80._8_4_ = 0x3f7ffffa;
  auVar80._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar80._12_4_ = 0x3f7ffffa;
  local_190 = vmulps_avx512vl(auVar84,auVar80);
  auVar84 = vpmaxsd_avx(auVar200,auVar164);
  auVar85 = vpmaxsd_avx(auVar192,auVar154);
  auVar84 = vminps_avx(auVar84,auVar85);
  auVar85 = vpmaxsd_avx(auVar185,auVar140);
  fVar161 = (ray->super_RayK<1>).tfar;
  auVar217._4_4_ = fVar161;
  auVar217._0_4_ = fVar161;
  auVar217._8_4_ = fVar161;
  auVar217._12_4_ = fVar161;
  auVar85 = vminps_avx512vl(auVar85,auVar217);
  auVar84 = vminps_avx(auVar84,auVar85);
  auVar30._8_4_ = 0x3f800003;
  auVar30._0_8_ = 0x3f8000033f800003;
  auVar30._12_4_ = 0x3f800003;
  auVar84 = vmulps_avx512vl(auVar84,auVar30);
  local_518 = pre;
  auVar85 = vpbroadcastd_avx512vl();
  uVar152 = vcmpps_avx512vl(local_190,auVar84,2);
  uVar75 = vpcmpgtd_avx512vl(auVar85,_DAT_01f7fcf0);
  uVar75 = ((byte)uVar152 & 0xf) & uVar75;
  if ((char)uVar75 != '\0') {
    auVar219 = ZEXT464(0xbf800000);
    local_520 = prim;
    local_538 = context;
    do {
      lVar27 = 0;
      for (uVar67 = uVar75; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar73 = *(uint *)(prim + 2);
      uVar69 = *(uint *)(prim + lVar27 * 4 + 6);
      local_530 = (ulong)uVar73;
      pGVar70 = (context->scene->geometries).items[uVar73].ptr;
      local_528 = (ulong)uVar69;
      uVar67 = (ulong)*(uint *)(*(long *)&pGVar70->field_0x58 +
                               (ulong)uVar69 *
                               pGVar70[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar161 = (pGVar70->time_range).lower;
      fVar161 = pGVar70->fnumTimeSegments *
                (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar161) /
                ((pGVar70->time_range).upper - fVar161));
      auVar84 = vroundss_avx(ZEXT416((uint)fVar161),ZEXT416((uint)fVar161),9);
      auVar85 = vaddss_avx512f(ZEXT416((uint)pGVar70->fnumTimeSegments),auVar219._0_16_);
      auVar84 = vminss_avx(auVar84,auVar85);
      auVar84 = vmaxss_avx(ZEXT816(0) << 0x20,auVar84);
      fVar161 = fVar161 - auVar84._0_4_;
      _Var9 = pGVar70[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar74 = (long)(int)auVar84._0_4_ * 0x38;
      lVar27 = *(long *)(_Var9 + 0x10 + lVar74);
      lVar72 = *(long *)(_Var9 + 0x38 + lVar74);
      lVar10 = *(long *)(_Var9 + 0x48 + lVar74);
      auVar155._4_4_ = fVar161;
      auVar155._0_4_ = fVar161;
      auVar155._8_4_ = fVar161;
      auVar155._12_4_ = fVar161;
      pfVar3 = (float *)(lVar72 + uVar67 * lVar10);
      auVar205._0_4_ = fVar161 * *pfVar3;
      auVar205._4_4_ = fVar161 * pfVar3[1];
      auVar205._8_4_ = fVar161 * pfVar3[2];
      auVar205._12_4_ = fVar161 * pfVar3[3];
      pfVar3 = (float *)(lVar72 + (uVar67 + 1) * lVar10);
      auVar207._0_4_ = fVar161 * *pfVar3;
      auVar207._4_4_ = fVar161 * pfVar3[1];
      auVar207._8_4_ = fVar161 * pfVar3[2];
      auVar207._12_4_ = fVar161 * pfVar3[3];
      auVar84 = vmulps_avx512vl(auVar155,*(undefined1 (*) [16])(lVar72 + (uVar67 + 2) * lVar10));
      auVar85 = vmulps_avx512vl(auVar155,*(undefined1 (*) [16])(lVar72 + lVar10 * (uVar67 + 3)));
      lVar72 = *(long *)(_Var9 + lVar74);
      fVar161 = 1.0 - fVar161;
      auVar141._4_4_ = fVar161;
      auVar141._0_4_ = fVar161;
      auVar141._8_4_ = fVar161;
      auVar141._12_4_ = fVar161;
      local_4b0 = vfmadd231ps_fma(auVar205,auVar141,*(undefined1 (*) [16])(lVar72 + lVar27 * uVar67)
                                 );
      local_4c0 = vfmadd231ps_fma(auVar207,auVar141,
                                  *(undefined1 (*) [16])(lVar72 + lVar27 * (uVar67 + 1)));
      local_4d0 = vfmadd231ps_avx512vl
                            (auVar84,auVar141,*(undefined1 (*) [16])(lVar72 + lVar27 * (uVar67 + 2))
                            );
      _local_4e0 = vfmadd231ps_avx512vl
                             (auVar85,auVar141,
                              *(undefined1 (*) [16])(lVar72 + lVar27 * (uVar67 + 3)));
      iVar8 = (int)pGVar70[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar27 = (long)iVar8 * 0x44;
      aVar4 = (ray->super_RayK<1>).org.field_0;
      auVar85 = vsubps_avx(local_4b0,(undefined1  [16])aVar4);
      uVar139 = auVar85._0_4_;
      auVar156._4_4_ = uVar139;
      auVar156._0_4_ = uVar139;
      auVar156._8_4_ = uVar139;
      auVar156._12_4_ = uVar139;
      auVar84 = vshufps_avx(auVar85,auVar85,0x55);
      aVar5 = (local_518->ray_space).vx.field_0;
      aVar6 = (local_518->ray_space).vy.field_0;
      auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
      fVar161 = (local_518->ray_space).vz.field_0.m128[0];
      fVar149 = (local_518->ray_space).vz.field_0.m128[1];
      fVar150 = (local_518->ray_space).vz.field_0.m128[2];
      fVar151 = (local_518->ray_space).vz.field_0.m128[3];
      auVar210._0_4_ = auVar85._0_4_ * fVar161;
      auVar210._4_4_ = auVar85._4_4_ * fVar149;
      auVar210._8_4_ = auVar85._8_4_ * fVar150;
      auVar210._12_4_ = auVar85._12_4_ * fVar151;
      auVar84 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar6,auVar84);
      auVar81 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar5,auVar156);
      auVar85 = vsubps_avx(local_4c0,(undefined1  [16])aVar4);
      uVar139 = auVar85._0_4_;
      auVar157._4_4_ = uVar139;
      auVar157._0_4_ = uVar139;
      auVar157._8_4_ = uVar139;
      auVar157._12_4_ = uVar139;
      auVar84 = vshufps_avx(auVar85,auVar85,0x55);
      auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
      auVar211._0_4_ = auVar85._0_4_ * fVar161;
      auVar211._4_4_ = auVar85._4_4_ * fVar149;
      auVar211._8_4_ = auVar85._8_4_ * fVar150;
      auVar211._12_4_ = auVar85._12_4_ * fVar151;
      auVar84 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar6,auVar84);
      auVar18 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar5,auVar157);
      auVar85 = vsubps_avx512vl(local_4d0,(undefined1  [16])aVar4);
      uVar139 = auVar85._0_4_;
      auVar158._4_4_ = uVar139;
      auVar158._0_4_ = uVar139;
      auVar158._8_4_ = uVar139;
      auVar158._12_4_ = uVar139;
      auVar84 = vshufps_avx(auVar85,auVar85,0x55);
      auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
      auVar212._0_4_ = auVar85._0_4_ * fVar161;
      auVar212._4_4_ = auVar85._4_4_ * fVar149;
      auVar212._8_4_ = auVar85._8_4_ * fVar150;
      auVar212._12_4_ = auVar85._12_4_ * fVar151;
      auVar84 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar6,auVar84);
      auVar19 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar5,auVar158);
      local_3e0 = ZEXT1632((undefined1  [16])aVar4);
      auVar85 = vsubps_avx512vl(_local_4e0,(undefined1  [16])aVar4);
      uVar139 = auVar85._0_4_;
      auVar159._4_4_ = uVar139;
      auVar159._0_4_ = uVar139;
      auVar159._8_4_ = uVar139;
      auVar159._12_4_ = uVar139;
      auVar84 = vshufps_avx(auVar85,auVar85,0x55);
      auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
      auVar214._0_4_ = auVar85._0_4_ * fVar161;
      auVar214._4_4_ = auVar85._4_4_ * fVar149;
      auVar214._8_4_ = auVar85._8_4_ * fVar150;
      auVar214._12_4_ = auVar85._12_4_ * fVar151;
      auVar84 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar6,auVar84);
      auVar82 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar5,auVar159);
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar27);
      uVar139 = auVar81._0_4_;
      local_2e0._4_4_ = uVar139;
      local_2e0._0_4_ = uVar139;
      local_2e0._8_4_ = uVar139;
      local_2e0._12_4_ = uVar139;
      local_2e0._16_4_ = uVar139;
      local_2e0._20_4_ = uVar139;
      local_2e0._24_4_ = uVar139;
      local_2e0._28_4_ = uVar139;
      auVar90._8_4_ = 1;
      auVar90._0_8_ = 0x100000001;
      auVar90._12_4_ = 1;
      auVar90._16_4_ = 1;
      auVar90._20_4_ = 1;
      auVar90._24_4_ = 1;
      auVar90._28_4_ = 1;
      local_300 = vpermps_avx2(auVar90,ZEXT1632(auVar81));
      auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x484);
      uVar139 = auVar18._0_4_;
      auVar176._4_4_ = uVar139;
      auVar176._0_4_ = uVar139;
      auVar176._8_4_ = uVar139;
      auVar176._12_4_ = uVar139;
      local_320._16_4_ = uVar139;
      local_320._0_16_ = auVar176;
      local_320._20_4_ = uVar139;
      local_320._24_4_ = uVar139;
      local_320._28_4_ = uVar139;
      auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x908);
      local_340 = vpermps_avx512vl(auVar90,ZEXT1632(auVar18));
      local_360 = vbroadcastss_avx512vl(auVar19);
      local_380 = vpermps_avx512vl(auVar90,ZEXT1632(auVar19));
      auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0xd8c);
      uVar139 = auVar82._0_4_;
      local_3a0._4_4_ = uVar139;
      local_3a0._0_4_ = uVar139;
      fStack_398 = (float)uVar139;
      fStack_394 = (float)uVar139;
      fStack_390 = (float)uVar139;
      fStack_38c = (float)uVar139;
      fStack_388 = (float)uVar139;
      register0x0000139c = uVar139;
      _local_3c0 = vpermps_avx512vl(auVar90,ZEXT1632(auVar82));
      auVar90 = vmulps_avx512vl(_local_3a0,auVar102);
      auVar91 = vmulps_avx512vl(_local_3c0,auVar102);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar103,local_360);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar103,local_380);
      auVar84 = vfmadd231ps_fma(auVar90,auVar105,local_320);
      auVar92 = vfmadd231ps_avx512vl(auVar91,auVar105,local_340);
      auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar104,local_2e0);
      auVar197 = ZEXT3264(auVar93);
      auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar27);
      auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x484);
      auVar94 = vfmadd231ps_avx512vl(auVar92,auVar104,local_300);
      auVar190 = ZEXT3264(auVar94);
      auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x908);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0xd8c);
      auVar95 = vmulps_avx512vl(_local_3a0,auVar101);
      auVar96 = vmulps_avx512vl(_local_3c0,auVar101);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar92,local_360);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,local_380);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,local_320);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar91,local_340);
      auVar20 = vfmadd231ps_fma(auVar95,auVar90,local_2e0);
      auVar203 = ZEXT1664(auVar20);
      auVar21 = vfmadd231ps_fma(auVar96,auVar90,local_300);
      auVar96 = vsubps_avx512vl(ZEXT1632(auVar20),auVar93);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar21),auVar94);
      auVar95 = vmulps_avx512vl(auVar94,auVar96);
      auVar98 = vmulps_avx512vl(auVar93,auVar97);
      auVar95 = vsubps_avx512vl(auVar95,auVar98);
      auVar84 = vshufps_avx(local_4b0,local_4b0,0xff);
      uVar152 = auVar84._0_8_;
      local_80._8_8_ = uVar152;
      local_80._0_8_ = uVar152;
      local_80._16_8_ = uVar152;
      local_80._24_8_ = uVar152;
      auVar84 = vshufps_avx(local_4c0,local_4c0,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar84);
      auVar84 = vshufps_avx512vl(local_4d0,local_4d0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar84);
      auVar84 = vshufps_avx512vl(_local_4e0,_local_4e0,0xff);
      uVar152 = auVar84._0_8_;
      local_e0._8_8_ = uVar152;
      local_e0._0_8_ = uVar152;
      local_e0._16_8_ = uVar152;
      local_e0._24_8_ = uVar152;
      auVar98 = vmulps_avx512vl(local_e0,auVar102);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar103,local_c0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar105,local_a0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar104,local_80);
      auVar99 = vmulps_avx512vl(local_e0,auVar101);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar92,local_c0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar91,local_a0);
      auVar83 = vfmadd231ps_fma(auVar99,auVar90,local_80);
      auVar99 = vmulps_avx512vl(auVar97,auVar97);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,auVar96);
      auVar100 = vmaxps_avx512vl(auVar98,ZEXT1632(auVar83));
      auVar100 = vmulps_avx512vl(auVar100,auVar100);
      auVar99 = vmulps_avx512vl(auVar100,auVar99);
      auVar95 = vmulps_avx512vl(auVar95,auVar95);
      uVar152 = vcmpps_avx512vl(auVar95,auVar99,2);
      auVar29 = local_4b0;
      auVar84 = vblendps_avx(auVar81,local_4b0,8);
      auVar217 = auVar218._0_16_;
      auVar85 = vandps_avx512vl(auVar84,auVar217);
      auVar28 = local_4c0;
      auVar84 = vblendps_avx(auVar18,local_4c0,8);
      auVar84 = vandps_avx512vl(auVar84,auVar217);
      auVar85 = vmaxps_avx(auVar85,auVar84);
      auVar23 = local_4d0;
      auVar84 = vblendps_avx(auVar19,local_4d0,8);
      auVar80 = vandps_avx512vl(auVar84,auVar217);
      auVar22 = _local_4e0;
      auVar84 = vblendps_avx(auVar82,_local_4e0,8);
      auVar84 = vandps_avx512vl(auVar84,auVar217);
      auVar84 = vmaxps_avx(auVar80,auVar84);
      auVar84 = vmaxps_avx(auVar85,auVar84);
      auVar85 = vmovshdup_avx(auVar84);
      auVar85 = vmaxss_avx(auVar85,auVar84);
      auVar84 = vshufpd_avx(auVar84,auVar84,1);
      auVar84 = vmaxss_avx(auVar84,auVar85);
      auVar85 = vcvtsi2ss_avx512f(auVar217,iVar8);
      local_460._0_16_ = auVar85;
      auVar100._0_4_ = auVar85._0_4_;
      auVar100._4_4_ = auVar100._0_4_;
      auVar100._8_4_ = auVar100._0_4_;
      auVar100._12_4_ = auVar100._0_4_;
      auVar100._16_4_ = auVar100._0_4_;
      auVar100._20_4_ = auVar100._0_4_;
      auVar100._24_4_ = auVar100._0_4_;
      auVar100._28_4_ = auVar100._0_4_;
      uVar24 = vcmpps_avx512vl(auVar100,_DAT_01faff40,0xe);
      bVar76 = (byte)uVar152 & (byte)uVar24;
      auVar84 = vmulss_avx512f(auVar84,SUB6416(ZEXT464(0x35000000),0));
      local_440._0_16_ = auVar84;
      auVar95 = local_440;
      auVar99._8_4_ = 2;
      auVar99._0_8_ = 0x200000002;
      auVar99._12_4_ = 2;
      auVar99._16_4_ = 2;
      auVar99._20_4_ = 2;
      auVar99._24_4_ = 2;
      auVar99._28_4_ = 2;
      local_120 = vpermps_avx2(auVar99,ZEXT1632(auVar81));
      local_140 = vpermps_avx2(auVar99,ZEXT1632(auVar18));
      local_160 = vpermps_avx2(auVar99,ZEXT1632(auVar19));
      local_180 = vpermps_avx2(auVar99,ZEXT1632(auVar82));
      _local_4e0 = auVar22;
      local_4d0 = auVar23;
      local_4c0 = auVar28;
      local_4b0 = auVar29;
      local_440 = auVar95;
      if (bVar76 != 0) {
        auVar101 = vmulps_avx512vl(local_180,auVar101);
        auVar92 = vfmadd213ps_avx512vl(auVar92,local_160,auVar101);
        auVar91 = vfmadd213ps_avx512vl(auVar91,local_140,auVar92);
        auVar101 = vfmadd213ps_avx512vl(auVar90,local_120,auVar91);
        auVar102 = vmulps_avx512vl(local_180,auVar102);
        auVar103 = vfmadd213ps_avx512vl(auVar103,local_160,auVar102);
        auVar91 = vfmadd213ps_avx512vl(auVar105,local_140,auVar103);
        auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1210);
        auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1694);
        auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1b18);
        auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1f9c);
        auVar95 = vfmadd213ps_avx512vl(auVar104,local_120,auVar91);
        auVar104 = vmulps_avx512vl(_local_3a0,auVar90);
        auVar91 = vmulps_avx512vl(_local_3c0,auVar90);
        auVar90 = vmulps_avx512vl(local_180,auVar90);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,local_360);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar102,local_380);
        auVar102 = vfmadd231ps_avx512vl(auVar90,local_160,auVar102);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar103,local_320);
        auVar90 = vfmadd231ps_avx512vl(auVar91,auVar103,local_340);
        auVar91 = vfmadd231ps_avx512vl(auVar102,local_140,auVar103);
        auVar85 = vfmadd231ps_fma(auVar104,auVar105,local_2e0);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar105,local_300);
        auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1210);
        auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1b18);
        auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1f9c);
        auVar91 = vfmadd231ps_avx512vl(auVar91,local_120,auVar105);
        auVar105 = vmulps_avx512vl(_local_3a0,auVar102);
        auVar92 = vmulps_avx512vl(_local_3c0,auVar102);
        auVar102 = vmulps_avx512vl(local_180,auVar102);
        auVar99 = vfmadd231ps_avx512vl(auVar105,auVar103,local_360);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar103,local_380);
        auVar103 = vfmadd231ps_avx512vl(auVar102,local_160,auVar103);
        auVar218 = ZEXT1664(auVar217);
        auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1694);
        auVar102 = vfmadd231ps_avx512vl(auVar99,auVar105,local_320);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar105,local_340);
        auVar105 = vfmadd231ps_avx512vl(auVar103,local_140,auVar105);
        auVar219 = ZEXT1664(auVar219._0_16_);
        auVar81 = vfmadd231ps_fma(auVar102,auVar104,local_2e0);
        auVar103 = vfmadd231ps_avx512vl(auVar92,auVar104,local_300);
        auVar102 = vfmadd231ps_avx512vl(auVar105,local_120,auVar104);
        auVar215._8_4_ = 0x7fffffff;
        auVar215._0_8_ = 0x7fffffff7fffffff;
        auVar215._12_4_ = 0x7fffffff;
        auVar215._16_4_ = 0x7fffffff;
        auVar215._20_4_ = 0x7fffffff;
        auVar215._24_4_ = 0x7fffffff;
        auVar215._28_4_ = 0x7fffffff;
        auVar104 = vandps_avx(ZEXT1632(auVar85),auVar215);
        auVar105 = vandps_avx(auVar90,auVar215);
        auVar105 = vmaxps_avx(auVar104,auVar105);
        auVar104 = vandps_avx(auVar91,auVar215);
        auVar104 = vmaxps_avx(auVar105,auVar104);
        local_440._0_4_ = auVar84._0_4_;
        auVar208._4_4_ = local_440._0_4_;
        auVar208._0_4_ = local_440._0_4_;
        auVar208._8_4_ = local_440._0_4_;
        auVar208._12_4_ = local_440._0_4_;
        auVar208._16_4_ = local_440._0_4_;
        auVar208._20_4_ = local_440._0_4_;
        auVar208._24_4_ = local_440._0_4_;
        auVar208._28_4_ = local_440._0_4_;
        uVar67 = vcmpps_avx512vl(auVar104,auVar208,1);
        bVar12 = (bool)((byte)uVar67 & 1);
        auVar106._0_4_ = (float)((uint)bVar12 * auVar96._0_4_ | (uint)!bVar12 * auVar85._0_4_);
        bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar85._4_4_);
        bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar85._8_4_);
        bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar85._12_4_);
        fVar161 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar96._16_4_);
        auVar106._16_4_ = fVar161;
        fVar150 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar96._20_4_);
        auVar106._20_4_ = fVar150;
        fVar149 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar96._24_4_);
        auVar106._24_4_ = fVar149;
        auVar106._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar96._28_4_;
        bVar12 = (bool)((byte)uVar67 & 1);
        auVar107._0_4_ = (float)((uint)bVar12 * auVar97._0_4_ | (uint)!bVar12 * auVar90._0_4_);
        bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar90._4_4_);
        bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar90._8_4_);
        bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar90._12_4_);
        bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar12 * auVar97._16_4_ | (uint)!bVar12 * auVar90._16_4_);
        bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar12 * auVar97._20_4_ | (uint)!bVar12 * auVar90._20_4_);
        bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar12 * auVar97._24_4_ | (uint)!bVar12 * auVar90._24_4_);
        bVar12 = SUB81(uVar67 >> 7,0);
        auVar107._28_4_ = (uint)bVar12 * auVar97._28_4_ | (uint)!bVar12 * auVar90._28_4_;
        auVar104 = vandps_avx(auVar215,ZEXT1632(auVar81));
        auVar105 = vandps_avx(auVar103,auVar215);
        auVar105 = vmaxps_avx(auVar104,auVar105);
        auVar104 = vandps_avx(auVar102,auVar215);
        auVar104 = vmaxps_avx(auVar105,auVar104);
        uVar67 = vcmpps_avx512vl(auVar104,auVar208,1);
        bVar12 = (bool)((byte)uVar67 & 1);
        auVar108._0_4_ = (float)((uint)bVar12 * auVar96._0_4_ | (uint)!bVar12 * auVar81._0_4_);
        bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar81._4_4_);
        bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar81._8_4_);
        bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar81._12_4_);
        fVar175 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar96._16_4_);
        auVar108._16_4_ = fVar175;
        fVar151 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar96._20_4_);
        auVar108._20_4_ = fVar151;
        fVar206 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar96._24_4_);
        auVar108._24_4_ = fVar206;
        uVar68 = (uint)(byte)(uVar67 >> 7) * auVar96._28_4_;
        auVar108._28_4_ = uVar68;
        bVar12 = (bool)((byte)uVar67 & 1);
        auVar109._0_4_ = (float)((uint)bVar12 * auVar97._0_4_ | (uint)!bVar12 * auVar103._0_4_);
        bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar103._4_4_);
        bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar103._8_4_);
        bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar103._12_4_);
        bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar109._16_4_ = (float)((uint)bVar12 * auVar97._16_4_ | (uint)!bVar12 * auVar103._16_4_);
        bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar109._20_4_ = (float)((uint)bVar12 * auVar97._20_4_ | (uint)!bVar12 * auVar103._20_4_);
        bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar109._24_4_ = (float)((uint)bVar12 * auVar97._24_4_ | (uint)!bVar12 * auVar103._24_4_);
        bVar12 = SUB81(uVar67 >> 7,0);
        auVar109._28_4_ = (uint)bVar12 * auVar97._28_4_ | (uint)!bVar12 * auVar103._28_4_;
        auVar89 = vxorps_avx512vl(auVar176,auVar176);
        auVar104 = vfmadd213ps_avx512vl(auVar106,auVar106,ZEXT1632(auVar89));
        auVar84 = vfmadd231ps_fma(auVar104,auVar107,auVar107);
        auVar105 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
        fVar78 = auVar105._0_4_;
        fVar79 = auVar105._4_4_;
        fVar130 = auVar105._8_4_;
        fVar131 = auVar105._12_4_;
        fVar132 = auVar105._16_4_;
        fVar133 = auVar105._20_4_;
        fVar135 = auVar105._24_4_;
        auVar104._4_4_ = fVar79 * fVar79 * fVar79 * auVar84._4_4_ * -0.5;
        auVar104._0_4_ = fVar78 * fVar78 * fVar78 * auVar84._0_4_ * -0.5;
        auVar104._8_4_ = fVar130 * fVar130 * fVar130 * auVar84._8_4_ * -0.5;
        auVar104._12_4_ = fVar131 * fVar131 * fVar131 * auVar84._12_4_ * -0.5;
        auVar104._16_4_ = fVar132 * fVar132 * fVar132 * -0.0;
        auVar104._20_4_ = fVar133 * fVar133 * fVar133 * -0.0;
        auVar104._24_4_ = fVar135 * fVar135 * fVar135 * -0.0;
        auVar104._28_4_ = auVar102._28_4_;
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar90,auVar105);
        auVar105._4_4_ = auVar107._4_4_ * auVar104._4_4_;
        auVar105._0_4_ = auVar107._0_4_ * auVar104._0_4_;
        auVar105._8_4_ = auVar107._8_4_ * auVar104._8_4_;
        auVar105._12_4_ = auVar107._12_4_ * auVar104._12_4_;
        auVar105._16_4_ = auVar107._16_4_ * auVar104._16_4_;
        auVar105._20_4_ = auVar107._20_4_ * auVar104._20_4_;
        auVar105._24_4_ = auVar107._24_4_ * auVar104._24_4_;
        auVar105._28_4_ = 0;
        auVar103._4_4_ = auVar104._4_4_ * -auVar106._4_4_;
        auVar103._0_4_ = auVar104._0_4_ * -auVar106._0_4_;
        auVar103._8_4_ = auVar104._8_4_ * -auVar106._8_4_;
        auVar103._12_4_ = auVar104._12_4_ * -auVar106._12_4_;
        auVar103._16_4_ = auVar104._16_4_ * -fVar161;
        auVar103._20_4_ = auVar104._20_4_ * -fVar150;
        auVar103._24_4_ = auVar104._24_4_ * -fVar149;
        auVar103._28_4_ = auVar107._28_4_;
        auVar104 = vmulps_avx512vl(auVar104,ZEXT1632(auVar89));
        auVar97 = ZEXT1632(auVar89);
        auVar102 = vfmadd213ps_avx512vl(auVar108,auVar108,auVar97);
        auVar84 = vfmadd231ps_fma(auVar102,auVar109,auVar109);
        auVar92 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
        fVar161 = auVar92._0_4_;
        fVar149 = auVar92._4_4_;
        fVar150 = auVar92._8_4_;
        fVar78 = auVar92._12_4_;
        fVar79 = auVar92._16_4_;
        fVar130 = auVar92._20_4_;
        fVar131 = auVar92._24_4_;
        auVar102._4_4_ = fVar149 * fVar149 * fVar149 * auVar84._4_4_ * -0.5;
        auVar102._0_4_ = fVar161 * fVar161 * fVar161 * auVar84._0_4_ * -0.5;
        auVar102._8_4_ = fVar150 * fVar150 * fVar150 * auVar84._8_4_ * -0.5;
        auVar102._12_4_ = fVar78 * fVar78 * fVar78 * auVar84._12_4_ * -0.5;
        auVar102._16_4_ = fVar79 * fVar79 * fVar79 * -0.0;
        auVar102._20_4_ = fVar130 * fVar130 * fVar130 * -0.0;
        auVar102._24_4_ = fVar131 * fVar131 * fVar131 * -0.0;
        auVar102._28_4_ = 0;
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar90,auVar92);
        auVar91._4_4_ = auVar109._4_4_ * auVar102._4_4_;
        auVar91._0_4_ = auVar109._0_4_ * auVar102._0_4_;
        auVar91._8_4_ = auVar109._8_4_ * auVar102._8_4_;
        auVar91._12_4_ = auVar109._12_4_ * auVar102._12_4_;
        auVar91._16_4_ = auVar109._16_4_ * auVar102._16_4_;
        auVar91._20_4_ = auVar109._20_4_ * auVar102._20_4_;
        auVar91._24_4_ = auVar109._24_4_ * auVar102._24_4_;
        auVar91._28_4_ = auVar92._28_4_;
        auVar92._4_4_ = -auVar108._4_4_ * auVar102._4_4_;
        auVar92._0_4_ = -auVar108._0_4_ * auVar102._0_4_;
        auVar92._8_4_ = -auVar108._8_4_ * auVar102._8_4_;
        auVar92._12_4_ = -auVar108._12_4_ * auVar102._12_4_;
        auVar92._16_4_ = -fVar175 * auVar102._16_4_;
        auVar92._20_4_ = -fVar151 * auVar102._20_4_;
        auVar92._24_4_ = -fVar206 * auVar102._24_4_;
        auVar92._28_4_ = uVar68 ^ 0x80000000;
        auVar102 = vmulps_avx512vl(auVar102,auVar97);
        auVar84 = vfmadd213ps_fma(auVar105,auVar98,auVar93);
        auVar85 = vfmadd213ps_fma(auVar103,auVar98,auVar94);
        auVar90 = vfmadd213ps_avx512vl(auVar104,auVar98,auVar95);
        auVar96 = vfmadd213ps_avx512vl(auVar91,ZEXT1632(auVar83),ZEXT1632(auVar20));
        auVar80 = vfnmadd213ps_fma(auVar105,auVar98,auVar93);
        auVar93 = ZEXT1632(auVar83);
        auVar81 = vfmadd213ps_fma(auVar92,auVar93,ZEXT1632(auVar21));
        auVar217 = vfnmadd213ps_fma(auVar103,auVar98,auVar94);
        auVar18 = vfmadd213ps_fma(auVar102,auVar93,auVar101);
        auVar105 = vfnmadd231ps_avx512vl(auVar95,auVar98,auVar104);
        auVar20 = vfnmadd213ps_fma(auVar91,auVar93,ZEXT1632(auVar20));
        auVar21 = vfnmadd213ps_fma(auVar92,auVar93,ZEXT1632(auVar21));
        auVar30 = vfnmadd231ps_fma(auVar101,ZEXT1632(auVar83),auVar102);
        auVar103 = vsubps_avx512vl(auVar96,ZEXT1632(auVar80));
        auVar104 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar217));
        auVar102 = vsubps_avx512vl(ZEXT1632(auVar18),auVar105);
        auVar91 = vmulps_avx512vl(auVar104,auVar105);
        auVar19 = vfmsub231ps_fma(auVar91,ZEXT1632(auVar217),auVar102);
        auVar101._4_4_ = auVar80._4_4_ * auVar102._4_4_;
        auVar101._0_4_ = auVar80._0_4_ * auVar102._0_4_;
        auVar101._8_4_ = auVar80._8_4_ * auVar102._8_4_;
        auVar101._12_4_ = auVar80._12_4_ * auVar102._12_4_;
        auVar101._16_4_ = auVar102._16_4_ * 0.0;
        auVar101._20_4_ = auVar102._20_4_ * 0.0;
        auVar101._24_4_ = auVar102._24_4_ * 0.0;
        auVar101._28_4_ = auVar102._28_4_;
        auVar102 = vfmsub231ps_avx512vl(auVar101,auVar105,auVar103);
        auVar95._4_4_ = auVar217._4_4_ * auVar103._4_4_;
        auVar95._0_4_ = auVar217._0_4_ * auVar103._0_4_;
        auVar95._8_4_ = auVar217._8_4_ * auVar103._8_4_;
        auVar95._12_4_ = auVar217._12_4_ * auVar103._12_4_;
        auVar95._16_4_ = auVar103._16_4_ * 0.0;
        auVar95._20_4_ = auVar103._20_4_ * 0.0;
        auVar95._24_4_ = auVar103._24_4_ * 0.0;
        auVar95._28_4_ = auVar103._28_4_;
        auVar82 = vfmsub231ps_fma(auVar95,ZEXT1632(auVar80),auVar104);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar97,auVar102);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar97,ZEXT1632(auVar19));
        auVar99 = ZEXT1632(auVar89);
        uVar67 = vcmpps_avx512vl(auVar104,auVar99,2);
        bVar66 = (byte)uVar67;
        fVar78 = (float)((uint)(bVar66 & 1) * auVar84._0_4_ |
                        (uint)!(bool)(bVar66 & 1) * auVar20._0_4_);
        bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
        fVar130 = (float)((uint)bVar12 * auVar84._4_4_ | (uint)!bVar12 * auVar20._4_4_);
        bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
        fVar132 = (float)((uint)bVar12 * auVar84._8_4_ | (uint)!bVar12 * auVar20._8_4_);
        bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
        fVar135 = (float)((uint)bVar12 * auVar84._12_4_ | (uint)!bVar12 * auVar20._12_4_);
        auVar92 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar132,CONCAT44(fVar130,fVar78))));
        fVar79 = (float)((uint)(bVar66 & 1) * auVar85._0_4_ |
                        (uint)!(bool)(bVar66 & 1) * auVar21._0_4_);
        bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
        fVar131 = (float)((uint)bVar12 * auVar85._4_4_ | (uint)!bVar12 * auVar21._4_4_);
        bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
        fVar133 = (float)((uint)bVar12 * auVar85._8_4_ | (uint)!bVar12 * auVar21._8_4_);
        bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
        fVar136 = (float)((uint)bVar12 * auVar85._12_4_ | (uint)!bVar12 * auVar21._12_4_);
        auVar101 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar133,CONCAT44(fVar131,fVar79))));
        auVar97._0_4_ =
             (float)((uint)(bVar66 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar30._0_4_)
        ;
        bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar97._4_4_ = (float)((uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar30._4_4_);
        bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar97._8_4_ = (float)((uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar30._8_4_);
        bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar97._12_4_ = (float)((uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar30._12_4_);
        fVar150 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar90._16_4_);
        auVar97._16_4_ = fVar150;
        fVar161 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar90._20_4_);
        auVar97._20_4_ = fVar161;
        fVar149 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar90._24_4_);
        auVar97._24_4_ = fVar149;
        iVar1 = (uint)(byte)(uVar67 >> 7) * auVar90._28_4_;
        auVar97._28_4_ = iVar1;
        auVar103 = vblendmps_avx512vl(ZEXT1632(auVar80),auVar96);
        auVar110._0_4_ =
             (uint)(bVar66 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar19._0_4_;
        bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar110._4_4_ = (uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar19._4_4_;
        bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar110._8_4_ = (uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar19._8_4_;
        bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar110._12_4_ = (uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar19._12_4_;
        auVar110._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar103._16_4_;
        auVar110._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar103._20_4_;
        auVar110._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar103._24_4_;
        auVar110._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar103._28_4_;
        auVar103 = vblendmps_avx512vl(ZEXT1632(auVar217),ZEXT1632(auVar81));
        auVar111._0_4_ =
             (float)((uint)(bVar66 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar85._0_4_
                    );
        bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar85._4_4_);
        bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar85._8_4_);
        bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar85._12_4_);
        fVar175 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar103._16_4_);
        auVar111._16_4_ = fVar175;
        fVar206 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar103._20_4_);
        auVar111._20_4_ = fVar206;
        fVar151 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar103._24_4_);
        auVar111._24_4_ = fVar151;
        auVar111._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar103._28_4_;
        auVar103 = vblendmps_avx512vl(auVar105,ZEXT1632(auVar18));
        auVar112._0_4_ =
             (float)((uint)(bVar66 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar90._0_4_
                    );
        bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar90._4_4_);
        bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar90._8_4_);
        bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar90._12_4_);
        bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar112._16_4_ = (float)((uint)bVar12 * auVar103._16_4_ | (uint)!bVar12 * auVar90._16_4_);
        bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar112._20_4_ = (float)((uint)bVar12 * auVar103._20_4_ | (uint)!bVar12 * auVar90._20_4_);
        bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar112._24_4_ = (float)((uint)bVar12 * auVar103._24_4_ | (uint)!bVar12 * auVar90._24_4_);
        bVar12 = SUB81(uVar67 >> 7,0);
        auVar112._28_4_ = (uint)bVar12 * auVar103._28_4_ | (uint)!bVar12 * auVar90._28_4_;
        auVar113._0_4_ =
             (uint)(bVar66 & 1) * (int)auVar80._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar96._0_4_;
        bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar113._4_4_ = (uint)bVar12 * (int)auVar80._4_4_ | (uint)!bVar12 * auVar96._4_4_;
        bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar113._8_4_ = (uint)bVar12 * (int)auVar80._8_4_ | (uint)!bVar12 * auVar96._8_4_;
        bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar113._12_4_ = (uint)bVar12 * (int)auVar80._12_4_ | (uint)!bVar12 * auVar96._12_4_;
        auVar113._16_4_ = (uint)!(bool)((byte)(uVar67 >> 4) & 1) * auVar96._16_4_;
        auVar113._20_4_ = (uint)!(bool)((byte)(uVar67 >> 5) & 1) * auVar96._20_4_;
        auVar113._24_4_ = (uint)!(bool)((byte)(uVar67 >> 6) & 1) * auVar96._24_4_;
        auVar113._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar96._28_4_;
        bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar114._0_4_ =
             (uint)(bVar66 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar18._0_4_;
        bVar13 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar13 * auVar105._4_4_ | (uint)!bVar13 * auVar18._4_4_;
        bVar13 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar13 * auVar105._8_4_ | (uint)!bVar13 * auVar18._8_4_;
        bVar13 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar13 * auVar105._12_4_ | (uint)!bVar13 * auVar18._12_4_;
        auVar114._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar105._16_4_;
        auVar114._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar105._20_4_;
        auVar114._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar105._24_4_;
        iVar2 = (uint)(byte)(uVar67 >> 7) * auVar105._28_4_;
        auVar114._28_4_ = iVar2;
        auVar95 = vsubps_avx512vl(auVar113,auVar92);
        auVar105 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar217._12_4_ |
                                                 (uint)!bVar15 * auVar81._12_4_,
                                                 CONCAT48((uint)bVar14 * (int)auVar217._8_4_ |
                                                          (uint)!bVar14 * auVar81._8_4_,
                                                          CONCAT44((uint)bVar12 *
                                                                   (int)auVar217._4_4_ |
                                                                   (uint)!bVar12 * auVar81._4_4_,
                                                                   (uint)(bVar66 & 1) *
                                                                   (int)auVar217._0_4_ |
                                                                   (uint)!(bool)(bVar66 & 1) *
                                                                   auVar81._0_4_)))),auVar101);
        auVar197 = ZEXT3264(auVar105);
        auVar103 = vsubps_avx(auVar114,auVar97);
        auVar102 = vsubps_avx(auVar92,auVar110);
        auVar203 = ZEXT3264(auVar102);
        auVar90 = vsubps_avx(auVar101,auVar111);
        auVar91 = vsubps_avx(auVar97,auVar112);
        auVar93._4_4_ = auVar103._4_4_ * fVar130;
        auVar93._0_4_ = auVar103._0_4_ * fVar78;
        auVar93._8_4_ = auVar103._8_4_ * fVar132;
        auVar93._12_4_ = auVar103._12_4_ * fVar135;
        auVar93._16_4_ = auVar103._16_4_ * 0.0;
        auVar93._20_4_ = auVar103._20_4_ * 0.0;
        auVar93._24_4_ = auVar103._24_4_ * 0.0;
        auVar93._28_4_ = iVar2;
        auVar84 = vfmsub231ps_fma(auVar93,auVar97,auVar95);
        auVar94._4_4_ = fVar131 * auVar95._4_4_;
        auVar94._0_4_ = fVar79 * auVar95._0_4_;
        auVar94._8_4_ = fVar133 * auVar95._8_4_;
        auVar94._12_4_ = fVar136 * auVar95._12_4_;
        auVar94._16_4_ = auVar95._16_4_ * 0.0;
        auVar94._20_4_ = auVar95._20_4_ * 0.0;
        auVar94._24_4_ = auVar95._24_4_ * 0.0;
        auVar94._28_4_ = auVar104._28_4_;
        auVar85 = vfmsub231ps_fma(auVar94,auVar92,auVar105);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar99,ZEXT1632(auVar84));
        auVar186._0_4_ = auVar105._0_4_ * auVar97._0_4_;
        auVar186._4_4_ = auVar105._4_4_ * auVar97._4_4_;
        auVar186._8_4_ = auVar105._8_4_ * auVar97._8_4_;
        auVar186._12_4_ = auVar105._12_4_ * auVar97._12_4_;
        auVar186._16_4_ = auVar105._16_4_ * fVar150;
        auVar186._20_4_ = auVar105._20_4_ * fVar161;
        auVar186._24_4_ = auVar105._24_4_ * fVar149;
        auVar186._28_4_ = 0;
        auVar84 = vfmsub231ps_fma(auVar186,auVar101,auVar103);
        auVar93 = vfmadd231ps_avx512vl(auVar104,auVar99,ZEXT1632(auVar84));
        auVar104 = vmulps_avx512vl(auVar91,auVar110);
        auVar104 = vfmsub231ps_avx512vl(auVar104,auVar102,auVar112);
        auVar96._4_4_ = auVar90._4_4_ * auVar112._4_4_;
        auVar96._0_4_ = auVar90._0_4_ * auVar112._0_4_;
        auVar96._8_4_ = auVar90._8_4_ * auVar112._8_4_;
        auVar96._12_4_ = auVar90._12_4_ * auVar112._12_4_;
        auVar96._16_4_ = auVar90._16_4_ * auVar112._16_4_;
        auVar96._20_4_ = auVar90._20_4_ * auVar112._20_4_;
        auVar96._24_4_ = auVar90._24_4_ * auVar112._24_4_;
        auVar96._28_4_ = auVar112._28_4_;
        auVar84 = vfmsub231ps_fma(auVar96,auVar111,auVar91);
        auVar187._0_4_ = auVar111._0_4_ * auVar102._0_4_;
        auVar187._4_4_ = auVar111._4_4_ * auVar102._4_4_;
        auVar187._8_4_ = auVar111._8_4_ * auVar102._8_4_;
        auVar187._12_4_ = auVar111._12_4_ * auVar102._12_4_;
        auVar187._16_4_ = fVar175 * auVar102._16_4_;
        auVar187._20_4_ = fVar206 * auVar102._20_4_;
        auVar187._24_4_ = fVar151 * auVar102._24_4_;
        auVar187._28_4_ = 0;
        auVar85 = vfmsub231ps_fma(auVar187,auVar90,auVar110);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar99,auVar104);
        auVar94 = vfmadd231ps_avx512vl(auVar104,auVar99,ZEXT1632(auVar84));
        auVar190 = ZEXT3264(auVar94);
        auVar104 = vmaxps_avx(auVar93,auVar94);
        uVar152 = vcmpps_avx512vl(auVar104,auVar99,2);
        bVar76 = bVar76 & (byte)uVar152;
        if (bVar76 != 0) {
          auVar41._4_4_ = auVar91._4_4_ * auVar105._4_4_;
          auVar41._0_4_ = auVar91._0_4_ * auVar105._0_4_;
          auVar41._8_4_ = auVar91._8_4_ * auVar105._8_4_;
          auVar41._12_4_ = auVar91._12_4_ * auVar105._12_4_;
          auVar41._16_4_ = auVar91._16_4_ * auVar105._16_4_;
          auVar41._20_4_ = auVar91._20_4_ * auVar105._20_4_;
          auVar41._24_4_ = auVar91._24_4_ * auVar105._24_4_;
          auVar41._28_4_ = auVar104._28_4_;
          auVar18 = vfmsub231ps_fma(auVar41,auVar90,auVar103);
          auVar42._4_4_ = auVar103._4_4_ * auVar102._4_4_;
          auVar42._0_4_ = auVar103._0_4_ * auVar102._0_4_;
          auVar42._8_4_ = auVar103._8_4_ * auVar102._8_4_;
          auVar42._12_4_ = auVar103._12_4_ * auVar102._12_4_;
          auVar42._16_4_ = auVar103._16_4_ * auVar102._16_4_;
          auVar42._20_4_ = auVar103._20_4_ * auVar102._20_4_;
          auVar42._24_4_ = auVar103._24_4_ * auVar102._24_4_;
          auVar42._28_4_ = auVar103._28_4_;
          auVar81 = vfmsub231ps_fma(auVar42,auVar95,auVar91);
          auVar43._4_4_ = auVar90._4_4_ * auVar95._4_4_;
          auVar43._0_4_ = auVar90._0_4_ * auVar95._0_4_;
          auVar43._8_4_ = auVar90._8_4_ * auVar95._8_4_;
          auVar43._12_4_ = auVar90._12_4_ * auVar95._12_4_;
          auVar43._16_4_ = auVar90._16_4_ * auVar95._16_4_;
          auVar43._20_4_ = auVar90._20_4_ * auVar95._20_4_;
          auVar43._24_4_ = auVar90._24_4_ * auVar95._24_4_;
          auVar43._28_4_ = auVar90._28_4_;
          auVar19 = vfmsub231ps_fma(auVar43,auVar102,auVar105);
          auVar84 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar19));
          auVar85 = vfmadd231ps_fma(ZEXT1632(auVar84),ZEXT1632(auVar18),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar104 = vrcp14ps_avx512vl(ZEXT1632(auVar85));
          auVar32._8_4_ = 0x3f800000;
          auVar32._0_8_ = 0x3f8000003f800000;
          auVar32._12_4_ = 0x3f800000;
          auVar32._16_4_ = 0x3f800000;
          auVar32._20_4_ = 0x3f800000;
          auVar32._24_4_ = 0x3f800000;
          auVar32._28_4_ = 0x3f800000;
          auVar105 = vfnmadd213ps_avx512vl(auVar104,ZEXT1632(auVar85),auVar32);
          auVar84 = vfmadd132ps_fma(auVar105,auVar104,auVar104);
          auVar197 = ZEXT1664(auVar84);
          auVar44._4_4_ = auVar19._4_4_ * auVar97._4_4_;
          auVar44._0_4_ = auVar19._0_4_ * auVar97._0_4_;
          auVar44._8_4_ = auVar19._8_4_ * auVar97._8_4_;
          auVar44._12_4_ = auVar19._12_4_ * auVar97._12_4_;
          auVar44._16_4_ = fVar150 * 0.0;
          auVar44._20_4_ = fVar161 * 0.0;
          auVar44._24_4_ = fVar149 * 0.0;
          auVar44._28_4_ = iVar1;
          auVar81 = vfmadd231ps_fma(auVar44,auVar101,ZEXT1632(auVar81));
          auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar92,ZEXT1632(auVar18));
          fVar149 = auVar84._0_4_;
          fVar150 = auVar84._4_4_;
          fVar151 = auVar84._8_4_;
          fVar206 = auVar84._12_4_;
          local_280._28_4_ = auVar104._28_4_;
          local_280._0_28_ =
               ZEXT1628(CONCAT412(auVar81._12_4_ * fVar206,
                                  CONCAT48(auVar81._8_4_ * fVar151,
                                           CONCAT44(auVar81._4_4_ * fVar150,auVar81._0_4_ * fVar149)
                                          )));
          auVar203 = ZEXT3264(local_280);
          auVar142._8_4_ = 3;
          auVar142._0_8_ = 0x300000003;
          auVar142._12_4_ = 3;
          auVar142._16_4_ = 3;
          auVar142._20_4_ = 3;
          auVar142._24_4_ = 3;
          auVar142._28_4_ = 3;
          auVar104 = vpermps_avx2(auVar142,ZEXT1632((undefined1  [16])aVar4));
          uVar152 = vcmpps_avx512vl(auVar104,local_280,2);
          fVar161 = (ray->super_RayK<1>).tfar;
          auVar33._4_4_ = fVar161;
          auVar33._0_4_ = fVar161;
          auVar33._8_4_ = fVar161;
          auVar33._12_4_ = fVar161;
          auVar33._16_4_ = fVar161;
          auVar33._20_4_ = fVar161;
          auVar33._24_4_ = fVar161;
          auVar33._28_4_ = fVar161;
          uVar24 = vcmpps_avx512vl(local_280,auVar33,2);
          bVar76 = (byte)uVar152 & (byte)uVar24 & bVar76;
          if (bVar76 != 0) {
            uVar77 = vcmpps_avx512vl(ZEXT1632(auVar85),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar77 = bVar76 & uVar77;
            if ((char)uVar77 != '\0') {
              fVar161 = auVar93._0_4_ * fVar149;
              fVar175 = auVar93._4_4_ * fVar150;
              auVar45._4_4_ = fVar175;
              auVar45._0_4_ = fVar161;
              fVar78 = auVar93._8_4_ * fVar151;
              auVar45._8_4_ = fVar78;
              fVar79 = auVar93._12_4_ * fVar206;
              auVar45._12_4_ = fVar79;
              fVar130 = auVar93._16_4_ * 0.0;
              auVar45._16_4_ = fVar130;
              fVar131 = auVar93._20_4_ * 0.0;
              auVar45._20_4_ = fVar131;
              fVar132 = auVar93._24_4_ * 0.0;
              auVar45._24_4_ = fVar132;
              auVar45._28_4_ = auVar93._28_4_;
              auVar143._8_4_ = 0x3f800000;
              auVar143._0_8_ = 0x3f8000003f800000;
              auVar143._12_4_ = 0x3f800000;
              auVar143._16_4_ = 0x3f800000;
              auVar143._20_4_ = 0x3f800000;
              auVar143._24_4_ = 0x3f800000;
              auVar143._28_4_ = 0x3f800000;
              auVar104 = vsubps_avx(auVar143,auVar45);
              local_2c0._0_4_ =
                   (float)((uint)(bVar66 & 1) * (int)fVar161 |
                          (uint)!(bool)(bVar66 & 1) * auVar104._0_4_);
              bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
              local_2c0._4_4_ =
                   (float)((uint)bVar12 * (int)fVar175 | (uint)!bVar12 * auVar104._4_4_);
              bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
              local_2c0._8_4_ = (float)((uint)bVar12 * (int)fVar78 | (uint)!bVar12 * auVar104._8_4_)
              ;
              bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
              local_2c0._12_4_ =
                   (float)((uint)bVar12 * (int)fVar79 | (uint)!bVar12 * auVar104._12_4_);
              bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
              local_2c0._16_4_ =
                   (float)((uint)bVar12 * (int)fVar130 | (uint)!bVar12 * auVar104._16_4_);
              bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
              local_2c0._20_4_ =
                   (float)((uint)bVar12 * (int)fVar131 | (uint)!bVar12 * auVar104._20_4_);
              bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
              local_2c0._24_4_ =
                   (float)((uint)bVar12 * (int)fVar132 | (uint)!bVar12 * auVar104._24_4_);
              bVar12 = SUB81(uVar67 >> 7,0);
              local_2c0._28_4_ =
                   (float)((uint)bVar12 * auVar93._28_4_ | (uint)!bVar12 * auVar104._28_4_);
              auVar104 = vsubps_avx(ZEXT1632(auVar83),auVar98);
              auVar84 = vfmadd213ps_fma(auVar104,local_2c0,auVar98);
              fVar161 = local_518->depth_scale;
              auVar98._4_4_ = fVar161;
              auVar98._0_4_ = fVar161;
              auVar98._8_4_ = fVar161;
              auVar98._12_4_ = fVar161;
              auVar98._16_4_ = fVar161;
              auVar98._20_4_ = fVar161;
              auVar98._24_4_ = fVar161;
              auVar98._28_4_ = fVar161;
              auVar104 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar84._12_4_ + auVar84._12_4_,
                                                            CONCAT48(auVar84._8_4_ + auVar84._8_4_,
                                                                     CONCAT44(auVar84._4_4_ +
                                                                              auVar84._4_4_,
                                                                              auVar84._0_4_ +
                                                                              auVar84._0_4_)))),
                                         auVar98);
              uVar25 = vcmpps_avx512vl(local_280,auVar104,6);
              uVar77 = uVar77 & uVar25;
              bVar76 = (byte)uVar77;
              if (bVar76 != 0) {
                auVar173._0_4_ = auVar94._0_4_ * fVar149;
                auVar173._4_4_ = auVar94._4_4_ * fVar150;
                auVar173._8_4_ = auVar94._8_4_ * fVar151;
                auVar173._12_4_ = auVar94._12_4_ * fVar206;
                auVar173._16_4_ = auVar94._16_4_ * 0.0;
                auVar173._20_4_ = auVar94._20_4_ * 0.0;
                auVar173._24_4_ = auVar94._24_4_ * 0.0;
                auVar173._28_4_ = 0;
                auVar181._8_4_ = 0x3f800000;
                auVar181._0_8_ = 0x3f8000003f800000;
                auVar181._12_4_ = 0x3f800000;
                auVar181._16_4_ = 0x3f800000;
                auVar181._20_4_ = 0x3f800000;
                auVar181._24_4_ = 0x3f800000;
                auVar181._28_4_ = 0x3f800000;
                auVar104 = vsubps_avx(auVar181,auVar173);
                auVar115._0_4_ =
                     (uint)(bVar66 & 1) * (int)auVar173._0_4_ |
                     (uint)!(bool)(bVar66 & 1) * auVar104._0_4_;
                bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
                auVar115._4_4_ = (uint)bVar12 * (int)auVar173._4_4_ | (uint)!bVar12 * auVar104._4_4_
                ;
                bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
                auVar115._8_4_ = (uint)bVar12 * (int)auVar173._8_4_ | (uint)!bVar12 * auVar104._8_4_
                ;
                bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
                auVar115._12_4_ =
                     (uint)bVar12 * (int)auVar173._12_4_ | (uint)!bVar12 * auVar104._12_4_;
                bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
                auVar115._16_4_ =
                     (uint)bVar12 * (int)auVar173._16_4_ | (uint)!bVar12 * auVar104._16_4_;
                bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
                auVar115._20_4_ =
                     (uint)bVar12 * (int)auVar173._20_4_ | (uint)!bVar12 * auVar104._20_4_;
                bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
                auVar115._24_4_ =
                     (uint)bVar12 * (int)auVar173._24_4_ | (uint)!bVar12 * auVar104._24_4_;
                auVar115._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar104._28_4_;
                auVar34._8_4_ = 0x40000000;
                auVar34._0_8_ = 0x4000000040000000;
                auVar34._12_4_ = 0x40000000;
                auVar34._16_4_ = 0x40000000;
                auVar34._20_4_ = 0x40000000;
                auVar34._24_4_ = 0x40000000;
                auVar34._28_4_ = 0x40000000;
                local_2a0 = vfmsub132ps_avx512vl(auVar115,auVar181,auVar34);
                local_260 = 0;
                local_25c = iVar8;
                local_250 = local_4b0._0_8_;
                uStack_248 = local_4b0._8_8_;
                local_240 = local_4c0._0_8_;
                uStack_238 = local_4c0._8_8_;
                local_230 = local_4d0._0_8_;
                uStack_228 = local_4d0._8_8_;
                local_220 = local_4e0;
                uStack_218 = uStack_4d8;
                if ((pGVar70->mask & (ray->super_RayK<1>).mask) != 0) {
                  fVar161 = 1.0 / auVar100._0_4_;
                  local_200[0] = fVar161 * (local_2c0._0_4_ + 0.0);
                  local_200[1] = fVar161 * (local_2c0._4_4_ + 1.0);
                  local_200[2] = fVar161 * (local_2c0._8_4_ + 2.0);
                  local_200[3] = fVar161 * (local_2c0._12_4_ + 3.0);
                  fStack_1f0 = fVar161 * (local_2c0._16_4_ + 4.0);
                  fStack_1ec = fVar161 * (local_2c0._20_4_ + 5.0);
                  fStack_1e8 = fVar161 * (local_2c0._24_4_ + 6.0);
                  fStack_1e4 = local_2c0._28_4_ + 7.0;
                  local_1e0 = local_2a0;
                  local_1c0 = local_280;
                  auVar144._8_4_ = 0x7f800000;
                  auVar144._0_8_ = 0x7f8000007f800000;
                  auVar144._12_4_ = 0x7f800000;
                  auVar144._16_4_ = 0x7f800000;
                  auVar144._20_4_ = 0x7f800000;
                  auVar144._24_4_ = 0x7f800000;
                  auVar144._28_4_ = 0x7f800000;
                  auVar104 = vblendmps_avx512vl(auVar144,local_280);
                  auVar116._0_4_ =
                       (uint)(bVar76 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar76 & 1) * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
                  auVar116._4_4_ = (uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
                  auVar116._8_4_ = (uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
                  auVar116._12_4_ = (uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar77 >> 4) & 1);
                  auVar116._16_4_ = (uint)bVar12 * auVar104._16_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar77 >> 5) & 1);
                  auVar116._20_4_ = (uint)bVar12 * auVar104._20_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar77 >> 6) & 1);
                  auVar116._24_4_ = (uint)bVar12 * auVar104._24_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = SUB81(uVar77 >> 7,0);
                  auVar116._28_4_ = (uint)bVar12 * auVar104._28_4_ | (uint)!bVar12 * 0x7f800000;
                  auVar104 = vshufps_avx(auVar116,auVar116,0xb1);
                  auVar104 = vminps_avx(auVar116,auVar104);
                  auVar105 = vshufpd_avx(auVar104,auVar104,5);
                  auVar104 = vminps_avx(auVar104,auVar105);
                  auVar105 = vpermpd_avx2(auVar104,0x4e);
                  auVar104 = vminps_avx(auVar104,auVar105);
                  uVar152 = vcmpps_avx512vl(auVar116,auVar104,0);
                  uVar68 = (uint)uVar77;
                  if (((byte)uVar152 & bVar76) != 0) {
                    uVar68 = (uint)((byte)uVar152 & bVar76);
                  }
                  uVar26 = 0;
                  for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
                    uVar26 = uVar26 + 1;
                  }
                  uVar67 = (ulong)uVar26;
                  if ((local_538->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar70->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_400 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                    local_420 = local_280;
                    pRVar71 = local_538;
                    do {
                      local_494 = local_200[uVar67];
                      local_490 = *(undefined4 *)(local_1e0 + uVar67 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar67 * 4);
                      local_510.context = pRVar71->user;
                      fVar149 = 1.0 - local_494;
                      fVar161 = fVar149 * fVar149 * -3.0;
                      auVar190 = ZEXT464((uint)fVar161);
                      auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar149 * fVar149)),
                                                ZEXT416((uint)(local_494 * fVar149)),
                                                ZEXT416(0xc0000000));
                      auVar85 = vfmsub132ss_fma(ZEXT416((uint)(local_494 * fVar149)),
                                                ZEXT416((uint)(local_494 * local_494)),
                                                ZEXT416(0x40000000));
                      fVar149 = auVar84._0_4_ * 3.0;
                      fVar150 = auVar85._0_4_ * 3.0;
                      fVar151 = local_494 * local_494 * 3.0;
                      auVar196._0_4_ = fVar151 * (float)local_4e0._0_4_;
                      auVar196._4_4_ = fVar151 * (float)local_4e0._4_4_;
                      auVar196._8_4_ = fVar151 * (float)uStack_4d8;
                      auVar196._12_4_ = fVar151 * uStack_4d8._4_4_;
                      auVar197 = ZEXT1664(auVar196);
                      auVar171._4_4_ = fVar150;
                      auVar171._0_4_ = fVar150;
                      auVar171._8_4_ = fVar150;
                      auVar171._12_4_ = fVar150;
                      auVar84 = vfmadd132ps_fma(auVar171,auVar196,local_4d0);
                      auVar180._4_4_ = fVar149;
                      auVar180._0_4_ = fVar149;
                      auVar180._8_4_ = fVar149;
                      auVar180._12_4_ = fVar149;
                      auVar84 = vfmadd132ps_fma(auVar180,auVar84,local_4c0);
                      auVar172._4_4_ = fVar161;
                      auVar172._0_4_ = fVar161;
                      auVar172._8_4_ = fVar161;
                      auVar172._12_4_ = fVar161;
                      auVar84 = vfmadd132ps_fma(auVar172,auVar84,local_4b0);
                      local_4a0 = vmovlps_avx(auVar84);
                      local_498 = vextractps_avx(auVar84,2);
                      local_48c = (int)local_528;
                      local_488 = (int)local_530;
                      local_484 = (local_510.context)->instID[0];
                      local_480 = (local_510.context)->instPrimID[0];
                      local_53c = -1;
                      local_510.valid = &local_53c;
                      local_510.geometryUserPtr = pGVar70->userPtr;
                      local_510.ray = (RTCRayN *)ray;
                      local_510.hit = (RTCHitN *)&local_4a0;
                      local_510.N = 1;
                      if (pGVar70->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b78fd4:
                        p_Var11 = pRVar71->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((pRVar71->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar70->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar190 = ZEXT1664(auVar190._0_16_);
                          auVar197 = ZEXT1664(auVar197._0_16_);
                          (*p_Var11)(&local_510);
                          auVar203 = ZEXT3264(local_420);
                          auVar219 = ZEXT464(0xbf800000);
                          auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar218 = ZEXT1664(auVar84);
                          pRVar71 = local_538;
                          if (*local_510.valid == 0) goto LAB_01b79088;
                        }
                        (((Vec3f *)((long)local_510.ray + 0x30))->field_0).components[0] =
                             *(float *)local_510.hit;
                        (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_510.hit + 4);
                        (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_510.hit + 8);
                        *(float *)((long)local_510.ray + 0x3c) = *(float *)(local_510.hit + 0xc);
                        *(float *)((long)local_510.ray + 0x40) = *(float *)(local_510.hit + 0x10);
                        *(float *)((long)local_510.ray + 0x44) = *(float *)(local_510.hit + 0x14);
                        *(float *)((long)local_510.ray + 0x48) = *(float *)(local_510.hit + 0x18);
                        *(float *)((long)local_510.ray + 0x4c) = *(float *)(local_510.hit + 0x1c);
                        *(float *)((long)local_510.ray + 0x50) = *(float *)(local_510.hit + 0x20);
                      }
                      else {
                        auVar190 = ZEXT464((uint)fVar161);
                        auVar197 = ZEXT1664(auVar196);
                        (*pGVar70->intersectionFilterN)(&local_510);
                        auVar203 = ZEXT3264(local_420);
                        auVar219 = ZEXT464(0xbf800000);
                        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar218 = ZEXT1664(auVar84);
                        pRVar71 = local_538;
                        if (*local_510.valid != 0) goto LAB_01b78fd4;
LAB_01b79088:
                        auVar219 = ZEXT464(0xbf800000);
                        (ray->super_RayK<1>).tfar = (float)local_400._0_4_;
                        pRVar71 = local_538;
                      }
                      bVar76 = ~(byte)(1 << ((uint)uVar67 & 0x1f)) & (byte)uVar77;
                      fVar161 = (ray->super_RayK<1>).tfar;
                      auVar40._4_4_ = fVar161;
                      auVar40._0_4_ = fVar161;
                      auVar40._8_4_ = fVar161;
                      auVar40._12_4_ = fVar161;
                      auVar40._16_4_ = fVar161;
                      auVar40._20_4_ = fVar161;
                      auVar40._24_4_ = fVar161;
                      auVar40._28_4_ = fVar161;
                      uVar152 = vcmpps_avx512vl(auVar203._0_32_,auVar40,2);
                      prim = local_520;
                      if ((bVar76 & (byte)uVar152) == 0) goto LAB_01b781da;
                      local_400 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                      bVar76 = bVar76 & (byte)uVar152;
                      uVar77 = (ulong)bVar76;
                      auVar148._8_4_ = 0x7f800000;
                      auVar148._0_8_ = 0x7f8000007f800000;
                      auVar148._12_4_ = 0x7f800000;
                      auVar148._16_4_ = 0x7f800000;
                      auVar148._20_4_ = 0x7f800000;
                      auVar148._24_4_ = 0x7f800000;
                      auVar148._28_4_ = 0x7f800000;
                      auVar104 = vblendmps_avx512vl(auVar148,auVar203._0_32_);
                      auVar129._0_4_ =
                           (uint)(bVar76 & 1) * auVar104._0_4_ |
                           (uint)!(bool)(bVar76 & 1) * 0x7f800000;
                      bVar12 = (bool)(bVar76 >> 1 & 1);
                      auVar129._4_4_ = (uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar76 >> 2 & 1);
                      auVar129._8_4_ = (uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar76 >> 3 & 1);
                      auVar129._12_4_ = (uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar76 >> 4 & 1);
                      auVar129._16_4_ = (uint)bVar12 * auVar104._16_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar76 >> 5 & 1);
                      auVar129._20_4_ = (uint)bVar12 * auVar104._20_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar76 >> 6 & 1);
                      auVar129._24_4_ = (uint)bVar12 * auVar104._24_4_ | (uint)!bVar12 * 0x7f800000;
                      auVar129._28_4_ =
                           (uint)(bVar76 >> 7) * auVar104._28_4_ |
                           (uint)!(bool)(bVar76 >> 7) * 0x7f800000;
                      auVar104 = vshufps_avx(auVar129,auVar129,0xb1);
                      auVar104 = vminps_avx(auVar129,auVar104);
                      auVar105 = vshufpd_avx(auVar104,auVar104,5);
                      auVar104 = vminps_avx(auVar104,auVar105);
                      auVar105 = vpermpd_avx2(auVar104,0x4e);
                      auVar104 = vminps_avx(auVar104,auVar105);
                      uVar152 = vcmpps_avx512vl(auVar129,auVar104,0);
                      bVar66 = (byte)uVar152 & bVar76;
                      if (bVar66 != 0) {
                        bVar76 = bVar66;
                      }
                      uVar73 = 0;
                      for (uVar69 = (uint)bVar76; (uVar69 & 1) == 0;
                          uVar69 = uVar69 >> 1 | 0x80000000) {
                        uVar73 = uVar73 + 1;
                      }
                      uVar67 = (ulong)uVar73;
                    } while( true );
                  }
                  fVar161 = local_200[uVar67];
                  fVar149 = *(float *)(local_1e0 + uVar67 * 4);
                  fVar151 = 1.0 - fVar161;
                  fVar150 = fVar151 * fVar151 * -3.0;
                  auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151)),
                                            ZEXT416((uint)(fVar161 * fVar151)),ZEXT416(0xc0000000));
                  auVar85 = vfmsub132ss_fma(ZEXT416((uint)(fVar161 * fVar151)),
                                            ZEXT416((uint)(fVar161 * fVar161)),ZEXT416(0x40000000));
                  fVar151 = auVar84._0_4_ * 3.0;
                  fVar206 = auVar85._0_4_ * 3.0;
                  fVar175 = fVar161 * fVar161 * 3.0;
                  auVar193._0_4_ = fVar175 * (float)local_4e0._0_4_;
                  auVar193._4_4_ = fVar175 * (float)local_4e0._4_4_;
                  auVar193._8_4_ = fVar175 * (float)uStack_4d8;
                  auVar193._12_4_ = fVar175 * uStack_4d8._4_4_;
                  auVar197 = ZEXT1664(auVar193);
                  auVar165._4_4_ = fVar206;
                  auVar165._0_4_ = fVar206;
                  auVar165._8_4_ = fVar206;
                  auVar165._12_4_ = fVar206;
                  auVar84 = vfmadd132ps_fma(auVar165,auVar193,local_4d0);
                  auVar177._4_4_ = fVar151;
                  auVar177._0_4_ = fVar151;
                  auVar177._8_4_ = fVar151;
                  auVar177._12_4_ = fVar151;
                  auVar84 = vfmadd132ps_fma(auVar177,auVar84,local_4c0);
                  auVar166._4_4_ = fVar150;
                  auVar166._0_4_ = fVar150;
                  auVar166._8_4_ = fVar150;
                  auVar166._12_4_ = fVar150;
                  auVar190 = ZEXT464((uint)*(float *)(local_1c0 + uVar67 * 4));
                  (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar67 * 4);
                  auVar84 = vfmadd132ps_fma(auVar166,auVar84,local_4b0);
                  uVar152 = vmovlps_avx(auVar84);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar152;
                  fVar150 = (float)vextractps_avx(auVar84,2);
                  (ray->Ng).field_0.field_0.z = fVar150;
                  ray->u = fVar161;
                  ray->v = fVar149;
                  ray->primID = uVar69;
                  ray->geomID = uVar73;
                  ray->instID[0] = local_538->user->instID[0];
                  ray->instPrimID[0] = local_538->user->instPrimID[0];
                  prim = local_520;
                }
              }
            }
          }
        }
      }
LAB_01b781da:
      context = local_538;
      if (8 < iVar8) {
        local_400 = vpbroadcastd_avx512vl();
        local_420._4_4_ = local_440._0_4_;
        local_420._0_4_ = local_440._0_4_;
        local_420._8_4_ = local_440._0_4_;
        local_420._12_4_ = local_440._0_4_;
        local_420._16_4_ = local_440._0_4_;
        local_420._20_4_ = local_440._0_4_;
        local_420._24_4_ = local_440._0_4_;
        local_420._28_4_ = local_440._0_4_;
        auVar145._8_4_ = 3;
        auVar145._0_8_ = 0x300000003;
        auVar145._12_4_ = 3;
        auVar145._16_4_ = 3;
        auVar145._20_4_ = 3;
        auVar145._24_4_ = 3;
        auVar145._28_4_ = 3;
        local_3e0 = vpermps_avx2(auVar145,local_3e0);
        local_100 = 1.0 / (float)local_460._0_4_;
        fStack_fc = local_100;
        fStack_f8 = local_100;
        fStack_f4 = local_100;
        fStack_f0 = local_100;
        fStack_ec = local_100;
        fStack_e8 = local_100;
        fStack_e4 = local_100;
        lVar72 = 8;
LAB_01b78277:
        auVar104 = vpbroadcastd_avx512vl();
        auVar104 = vpor_avx2(auVar104,_DAT_01fe9900);
        uVar24 = vpcmpd_avx512vl(auVar104,local_400,1);
        auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 * 4 + lVar27);
        auVar105 = *(undefined1 (*) [32])(lVar27 + 0x21aa768 + lVar72 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar27 + 0x21aabec + lVar72 * 4);
        auVar102 = *(undefined1 (*) [32])(lVar27 + 0x21ab070 + lVar72 * 4);
        fVar161 = auVar102._0_4_;
        auVar198._0_4_ = fVar161 * (float)local_3a0._0_4_;
        fVar149 = auVar102._4_4_;
        auVar198._4_4_ = fVar149 * (float)local_3a0._4_4_;
        fVar150 = auVar102._8_4_;
        auVar198._8_4_ = fVar150 * fStack_398;
        fVar151 = auVar102._12_4_;
        auVar198._12_4_ = fVar151 * fStack_394;
        fVar206 = auVar102._16_4_;
        auVar198._16_4_ = fVar206 * fStack_390;
        fVar175 = auVar102._20_4_;
        auVar198._20_4_ = fVar175 * fStack_38c;
        auVar198._28_36_ = auVar197._28_36_;
        fVar78 = auVar102._24_4_;
        auVar198._24_4_ = fVar78 * fStack_388;
        auVar197._0_4_ = fVar161 * (float)local_3c0._0_4_;
        auVar197._4_4_ = fVar149 * (float)local_3c0._4_4_;
        auVar197._8_4_ = fVar150 * fStack_3b8;
        auVar197._12_4_ = fVar151 * fStack_3b4;
        auVar197._16_4_ = fVar206 * fStack_3b0;
        auVar197._20_4_ = fVar175 * fStack_3ac;
        auVar197._28_36_ = auVar190._28_36_;
        auVar197._24_4_ = fVar78 * fStack_3a8;
        auVar90 = vmulps_avx512vl(local_e0,auVar102);
        auVar91 = vfmadd231ps_avx512vl(auVar198._0_32_,auVar103,local_360);
        auVar92 = vfmadd231ps_avx512vl(auVar197._0_32_,auVar103,local_380);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar103,local_c0);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar105,local_320);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar105,local_340);
        auVar101 = vfmadd231ps_avx512vl(auVar90,auVar105,local_a0);
        auVar84 = vfmadd231ps_fma(auVar91,auVar104,local_2e0);
        auVar197 = ZEXT1664(auVar84);
        auVar85 = vfmadd231ps_fma(auVar92,auVar104,local_300);
        auVar190 = ZEXT1664(auVar85);
        auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 * 4 + lVar27);
        auVar91 = *(undefined1 (*) [32])(lVar27 + 0x21acb88 + lVar72 * 4);
        auVar93 = vfmadd231ps_avx512vl(auVar101,auVar104,local_80);
        auVar92 = *(undefined1 (*) [32])(lVar27 + 0x21ad00c + lVar72 * 4);
        auVar101 = *(undefined1 (*) [32])(lVar27 + 0x21ad490 + lVar72 * 4);
        fVar79 = auVar101._0_4_;
        auVar204._0_4_ = fVar79 * (float)local_3a0._0_4_;
        fVar130 = auVar101._4_4_;
        auVar204._4_4_ = fVar130 * (float)local_3a0._4_4_;
        fVar131 = auVar101._8_4_;
        auVar204._8_4_ = fVar131 * fStack_398;
        fVar132 = auVar101._12_4_;
        auVar204._12_4_ = fVar132 * fStack_394;
        fVar133 = auVar101._16_4_;
        auVar204._16_4_ = fVar133 * fStack_390;
        fVar135 = auVar101._20_4_;
        auVar204._20_4_ = fVar135 * fStack_38c;
        auVar204._28_36_ = auVar203._28_36_;
        fVar136 = auVar101._24_4_;
        auVar204._24_4_ = fVar136 * fStack_388;
        auVar46._4_4_ = fVar130 * (float)local_3c0._4_4_;
        auVar46._0_4_ = fVar79 * (float)local_3c0._0_4_;
        auVar46._8_4_ = fVar131 * fStack_3b8;
        auVar46._12_4_ = fVar132 * fStack_3b4;
        auVar46._16_4_ = fVar133 * fStack_3b0;
        auVar46._20_4_ = fVar135 * fStack_3ac;
        auVar46._24_4_ = fVar136 * fStack_3a8;
        auVar46._28_4_ = uStack_3a4;
        auVar95 = vmulps_avx512vl(local_e0,auVar101);
        auVar94 = vfmadd231ps_avx512vl(auVar204._0_32_,auVar92,local_360);
        auVar96 = vfmadd231ps_avx512vl(auVar46,auVar92,local_380);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar92,local_c0);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar91,local_320);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar91,local_340);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,local_a0);
        auVar81 = vfmadd231ps_fma(auVar94,auVar90,local_2e0);
        auVar203 = ZEXT1664(auVar81);
        auVar18 = vfmadd231ps_fma(auVar96,auVar90,local_300);
        auVar94 = vfmadd231ps_avx512vl(auVar95,auVar90,local_80);
        auVar96 = vmaxps_avx512vl(auVar93,auVar94);
        auVar95 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar84));
        auVar97 = vsubps_avx512vl(ZEXT1632(auVar18),ZEXT1632(auVar85));
        auVar98 = vmulps_avx512vl(ZEXT1632(auVar85),auVar95);
        auVar99 = vmulps_avx512vl(ZEXT1632(auVar84),auVar97);
        auVar98 = vsubps_avx512vl(auVar98,auVar99);
        auVar99 = vmulps_avx512vl(auVar97,auVar97);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar95,auVar95);
        auVar96 = vmulps_avx512vl(auVar96,auVar96);
        auVar96 = vmulps_avx512vl(auVar96,auVar99);
        auVar98 = vmulps_avx512vl(auVar98,auVar98);
        uVar152 = vcmpps_avx512vl(auVar98,auVar96,2);
        bVar76 = (byte)uVar24 & (byte)uVar152;
        if (bVar76 != 0) {
          fVar134 = local_180._0_4_;
          fVar137 = local_180._4_4_;
          auVar47._4_4_ = fVar137 * fVar130;
          auVar47._0_4_ = fVar134 * fVar79;
          fVar79 = local_180._8_4_;
          auVar47._8_4_ = fVar79 * fVar131;
          fVar130 = local_180._12_4_;
          auVar47._12_4_ = fVar130 * fVar132;
          fVar131 = local_180._16_4_;
          auVar47._16_4_ = fVar131 * fVar133;
          fVar132 = local_180._20_4_;
          auVar47._20_4_ = fVar132 * fVar135;
          fVar133 = local_180._24_4_;
          auVar47._24_4_ = fVar133 * fVar136;
          auVar47._28_4_ = auVar101._28_4_;
          auVar92 = vfmadd213ps_avx512vl(auVar92,local_160,auVar47);
          auVar91 = vfmadd213ps_avx512vl(auVar91,local_140,auVar92);
          auVar90 = vfmadd213ps_avx512vl(auVar90,local_120,auVar91);
          auVar48._4_4_ = fVar137 * fVar149;
          auVar48._0_4_ = fVar134 * fVar161;
          auVar48._8_4_ = fVar79 * fVar150;
          auVar48._12_4_ = fVar130 * fVar151;
          auVar48._16_4_ = fVar131 * fVar206;
          auVar48._20_4_ = fVar132 * fVar175;
          auVar48._24_4_ = fVar133 * fVar78;
          auVar48._28_4_ = auVar102._28_4_;
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_160,auVar48);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_140,auVar103);
          auVar91 = vfmadd213ps_avx512vl(auVar104,local_120,auVar105);
          auVar104 = *(undefined1 (*) [32])(lVar27 + 0x21ab4f4 + lVar72 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar27 + 0x21ab978 + lVar72 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar27 + 0x21abdfc + lVar72 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar27 + 0x21ac280 + lVar72 * 4);
          auVar92 = vmulps_avx512vl(_local_3a0,auVar102);
          auVar101 = vmulps_avx512vl(_local_3c0,auVar102);
          auVar49._4_4_ = fVar137 * auVar102._4_4_;
          auVar49._0_4_ = fVar134 * auVar102._0_4_;
          auVar49._8_4_ = fVar79 * auVar102._8_4_;
          auVar49._12_4_ = fVar130 * auVar102._12_4_;
          auVar49._16_4_ = fVar131 * auVar102._16_4_;
          auVar49._20_4_ = fVar132 * auVar102._20_4_;
          auVar49._24_4_ = fVar133 * auVar102._24_4_;
          auVar49._28_4_ = auVar102._28_4_;
          auVar102 = vfmadd231ps_avx512vl(auVar92,auVar103,local_360);
          auVar92 = vfmadd231ps_avx512vl(auVar101,auVar103,local_380);
          auVar103 = vfmadd231ps_avx512vl(auVar49,local_160,auVar103);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar105,local_320);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar105,local_340);
          auVar105 = vfmadd231ps_avx512vl(auVar103,local_140,auVar105);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar104,local_2e0);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar104,local_300);
          auVar101 = vfmadd231ps_avx512vl(auVar105,local_120,auVar104);
          auVar104 = *(undefined1 (*) [32])(lVar27 + 0x21ad914 + lVar72 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar27 + 0x21ae21c + lVar72 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar27 + 0x21ae6a0 + lVar72 * 4);
          auVar96 = vmulps_avx512vl(_local_3a0,auVar103);
          auVar98 = vmulps_avx512vl(_local_3c0,auVar103);
          auVar103 = vmulps_avx512vl(local_180,auVar103);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar105,local_360);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar105,local_380);
          auVar103 = vfmadd231ps_avx512vl(auVar103,local_160,auVar105);
          auVar218 = ZEXT1664(auVar218._0_16_);
          auVar105 = *(undefined1 (*) [32])(lVar27 + 0x21add98 + lVar72 * 4);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar105,local_320);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar105,local_340);
          auVar105 = vfmadd231ps_avx512vl(auVar103,local_140,auVar105);
          auVar219 = ZEXT1664(auVar219._0_16_);
          auVar103 = vfmadd231ps_avx512vl(auVar96,auVar104,local_2e0);
          auVar96 = vfmadd231ps_avx512vl(auVar98,auVar104,local_300);
          auVar105 = vfmadd231ps_avx512vl(auVar105,local_120,auVar104);
          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar102,auVar98);
          vandps_avx512vl(auVar92,auVar98);
          auVar104 = vmaxps_avx(auVar98,auVar98);
          vandps_avx512vl(auVar101,auVar98);
          auVar104 = vmaxps_avx(auVar104,auVar98);
          uVar67 = vcmpps_avx512vl(auVar104,local_420,1);
          bVar12 = (bool)((byte)uVar67 & 1);
          auVar117._0_4_ = (float)((uint)bVar12 * auVar95._0_4_ | (uint)!bVar12 * auVar102._0_4_);
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar102._4_4_);
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar102._8_4_);
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar102._12_4_)
          ;
          bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar117._16_4_ = (float)((uint)bVar12 * auVar95._16_4_ | (uint)!bVar12 * auVar102._16_4_)
          ;
          bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar117._20_4_ = (float)((uint)bVar12 * auVar95._20_4_ | (uint)!bVar12 * auVar102._20_4_)
          ;
          bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar117._24_4_ = (float)((uint)bVar12 * auVar95._24_4_ | (uint)!bVar12 * auVar102._24_4_)
          ;
          bVar12 = SUB81(uVar67 >> 7,0);
          auVar117._28_4_ = (uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar102._28_4_;
          bVar12 = (bool)((byte)uVar67 & 1);
          auVar118._0_4_ = (float)((uint)bVar12 * auVar97._0_4_ | (uint)!bVar12 * auVar92._0_4_);
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar92._4_4_);
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar92._8_4_);
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar92._12_4_);
          bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar118._16_4_ = (float)((uint)bVar12 * auVar97._16_4_ | (uint)!bVar12 * auVar92._16_4_);
          bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar118._20_4_ = (float)((uint)bVar12 * auVar97._20_4_ | (uint)!bVar12 * auVar92._20_4_);
          bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar118._24_4_ = (float)((uint)bVar12 * auVar97._24_4_ | (uint)!bVar12 * auVar92._24_4_);
          bVar12 = SUB81(uVar67 >> 7,0);
          auVar118._28_4_ = (uint)bVar12 * auVar97._28_4_ | (uint)!bVar12 * auVar92._28_4_;
          vandps_avx512vl(auVar103,auVar98);
          vandps_avx512vl(auVar96,auVar98);
          auVar104 = vmaxps_avx(auVar118,auVar118);
          vandps_avx512vl(auVar105,auVar98);
          auVar104 = vmaxps_avx(auVar104,auVar118);
          uVar67 = vcmpps_avx512vl(auVar104,local_420,1);
          bVar12 = (bool)((byte)uVar67 & 1);
          auVar119._0_4_ = (uint)bVar12 * auVar95._0_4_ | (uint)!bVar12 * auVar103._0_4_;
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar119._4_4_ = (uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar103._4_4_;
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar119._8_4_ = (uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar103._8_4_;
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar119._12_4_ = (uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar103._12_4_;
          bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar119._16_4_ = (uint)bVar12 * auVar95._16_4_ | (uint)!bVar12 * auVar103._16_4_;
          bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar119._20_4_ = (uint)bVar12 * auVar95._20_4_ | (uint)!bVar12 * auVar103._20_4_;
          bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar119._24_4_ = (uint)bVar12 * auVar95._24_4_ | (uint)!bVar12 * auVar103._24_4_;
          bVar12 = SUB81(uVar67 >> 7,0);
          auVar119._28_4_ = (uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar103._28_4_;
          bVar12 = (bool)((byte)uVar67 & 1);
          auVar120._0_4_ = (float)((uint)bVar12 * auVar97._0_4_ | (uint)!bVar12 * auVar96._0_4_);
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar96._4_4_);
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar96._8_4_);
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar96._12_4_);
          bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar120._16_4_ = (float)((uint)bVar12 * auVar97._16_4_ | (uint)!bVar12 * auVar96._16_4_);
          bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar120._20_4_ = (float)((uint)bVar12 * auVar97._20_4_ | (uint)!bVar12 * auVar96._20_4_);
          bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar120._24_4_ = (float)((uint)bVar12 * auVar97._24_4_ | (uint)!bVar12 * auVar96._24_4_);
          bVar12 = SUB81(uVar67 >> 7,0);
          auVar120._28_4_ = (uint)bVar12 * auVar97._28_4_ | (uint)!bVar12 * auVar96._28_4_;
          auVar209._8_4_ = 0x80000000;
          auVar209._0_8_ = 0x8000000080000000;
          auVar209._12_4_ = 0x80000000;
          auVar209._16_4_ = 0x80000000;
          auVar209._20_4_ = 0x80000000;
          auVar209._24_4_ = 0x80000000;
          auVar209._28_4_ = 0x80000000;
          auVar104 = vxorps_avx512vl(auVar119,auVar209);
          auVar80 = vxorps_avx512vl(auVar98._0_16_,auVar98._0_16_);
          auVar105 = vfmadd213ps_avx512vl(auVar117,auVar117,ZEXT1632(auVar80));
          auVar19 = vfmadd231ps_fma(auVar105,auVar118,auVar118);
          auVar105 = vrsqrt14ps_avx512vl(ZEXT1632(auVar19));
          auVar216._8_4_ = 0xbf000000;
          auVar216._0_8_ = 0xbf000000bf000000;
          auVar216._12_4_ = 0xbf000000;
          auVar216._16_4_ = 0xbf000000;
          auVar216._20_4_ = 0xbf000000;
          auVar216._24_4_ = 0xbf000000;
          auVar216._28_4_ = 0xbf000000;
          fVar161 = auVar105._0_4_;
          fVar149 = auVar105._4_4_;
          fVar150 = auVar105._8_4_;
          fVar151 = auVar105._12_4_;
          fVar206 = auVar105._16_4_;
          fVar175 = auVar105._20_4_;
          fVar78 = auVar105._24_4_;
          auVar50._4_4_ = fVar149 * fVar149 * fVar149 * auVar19._4_4_ * -0.5;
          auVar50._0_4_ = fVar161 * fVar161 * fVar161 * auVar19._0_4_ * -0.5;
          auVar50._8_4_ = fVar150 * fVar150 * fVar150 * auVar19._8_4_ * -0.5;
          auVar50._12_4_ = fVar151 * fVar151 * fVar151 * auVar19._12_4_ * -0.5;
          auVar50._16_4_ = fVar206 * fVar206 * fVar206 * -0.0;
          auVar50._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
          auVar50._24_4_ = fVar78 * fVar78 * fVar78 * -0.0;
          auVar50._28_4_ = auVar118._28_4_;
          auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar105 = vfmadd231ps_avx512vl(auVar50,auVar103,auVar105);
          auVar51._4_4_ = auVar118._4_4_ * auVar105._4_4_;
          auVar51._0_4_ = auVar118._0_4_ * auVar105._0_4_;
          auVar51._8_4_ = auVar118._8_4_ * auVar105._8_4_;
          auVar51._12_4_ = auVar118._12_4_ * auVar105._12_4_;
          auVar51._16_4_ = auVar118._16_4_ * auVar105._16_4_;
          auVar51._20_4_ = auVar118._20_4_ * auVar105._20_4_;
          auVar51._24_4_ = auVar118._24_4_ * auVar105._24_4_;
          auVar51._28_4_ = 0;
          auVar52._4_4_ = auVar105._4_4_ * -auVar117._4_4_;
          auVar52._0_4_ = auVar105._0_4_ * -auVar117._0_4_;
          auVar52._8_4_ = auVar105._8_4_ * -auVar117._8_4_;
          auVar52._12_4_ = auVar105._12_4_ * -auVar117._12_4_;
          auVar52._16_4_ = auVar105._16_4_ * -auVar117._16_4_;
          auVar52._20_4_ = auVar105._20_4_ * -auVar117._20_4_;
          auVar52._24_4_ = auVar105._24_4_ * -auVar117._24_4_;
          auVar52._28_4_ = auVar118._28_4_;
          auVar102 = vmulps_avx512vl(auVar105,ZEXT1632(auVar80));
          auVar101 = ZEXT1632(auVar80);
          auVar105 = vfmadd213ps_avx512vl(auVar119,auVar119,auVar101);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar120,auVar120);
          auVar92 = vrsqrt14ps_avx512vl(auVar105);
          auVar105 = vmulps_avx512vl(auVar105,auVar216);
          fVar161 = auVar92._0_4_;
          fVar149 = auVar92._4_4_;
          fVar150 = auVar92._8_4_;
          fVar151 = auVar92._12_4_;
          fVar206 = auVar92._16_4_;
          fVar175 = auVar92._20_4_;
          fVar78 = auVar92._24_4_;
          auVar53._4_4_ = fVar149 * fVar149 * fVar149 * auVar105._4_4_;
          auVar53._0_4_ = fVar161 * fVar161 * fVar161 * auVar105._0_4_;
          auVar53._8_4_ = fVar150 * fVar150 * fVar150 * auVar105._8_4_;
          auVar53._12_4_ = fVar151 * fVar151 * fVar151 * auVar105._12_4_;
          auVar53._16_4_ = fVar206 * fVar206 * fVar206 * auVar105._16_4_;
          auVar53._20_4_ = fVar175 * fVar175 * fVar175 * auVar105._20_4_;
          auVar53._24_4_ = fVar78 * fVar78 * fVar78 * auVar105._24_4_;
          auVar53._28_4_ = auVar105._28_4_;
          auVar105 = vfmadd231ps_avx512vl(auVar53,auVar103,auVar92);
          auVar54._4_4_ = auVar120._4_4_ * auVar105._4_4_;
          auVar54._0_4_ = auVar120._0_4_ * auVar105._0_4_;
          auVar54._8_4_ = auVar120._8_4_ * auVar105._8_4_;
          auVar54._12_4_ = auVar120._12_4_ * auVar105._12_4_;
          auVar54._16_4_ = auVar120._16_4_ * auVar105._16_4_;
          auVar54._20_4_ = auVar120._20_4_ * auVar105._20_4_;
          auVar54._24_4_ = auVar120._24_4_ * auVar105._24_4_;
          auVar54._28_4_ = auVar92._28_4_;
          auVar55._4_4_ = auVar105._4_4_ * auVar104._4_4_;
          auVar55._0_4_ = auVar105._0_4_ * auVar104._0_4_;
          auVar55._8_4_ = auVar105._8_4_ * auVar104._8_4_;
          auVar55._12_4_ = auVar105._12_4_ * auVar104._12_4_;
          auVar55._16_4_ = auVar105._16_4_ * auVar104._16_4_;
          auVar55._20_4_ = auVar105._20_4_ * auVar104._20_4_;
          auVar55._24_4_ = auVar105._24_4_ * auVar104._24_4_;
          auVar55._28_4_ = auVar104._28_4_;
          auVar104 = vmulps_avx512vl(auVar105,auVar101);
          auVar19 = vfmadd213ps_fma(auVar51,auVar93,ZEXT1632(auVar84));
          auVar82 = vfmadd213ps_fma(auVar52,auVar93,ZEXT1632(auVar85));
          auVar103 = vfmadd213ps_avx512vl(auVar102,auVar93,auVar91);
          auVar92 = vfmadd213ps_avx512vl(auVar54,auVar94,ZEXT1632(auVar81));
          auVar21 = vfnmadd213ps_fma(auVar51,auVar93,ZEXT1632(auVar84));
          auVar84 = vfmadd213ps_fma(auVar55,auVar94,ZEXT1632(auVar18));
          auVar83 = vfnmadd213ps_fma(auVar52,auVar93,ZEXT1632(auVar85));
          auVar85 = vfmadd213ps_fma(auVar104,auVar94,auVar90);
          auVar28 = vfnmadd231ps_fma(auVar91,auVar93,auVar102);
          auVar22 = vfnmadd213ps_fma(auVar54,auVar94,ZEXT1632(auVar81));
          auVar23 = vfnmadd213ps_fma(auVar55,auVar94,ZEXT1632(auVar18));
          auVar29 = vfnmadd231ps_fma(auVar90,auVar94,auVar104);
          auVar90 = vsubps_avx512vl(auVar92,ZEXT1632(auVar21));
          auVar104 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar83));
          auVar105 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar28));
          auVar56._4_4_ = auVar104._4_4_ * auVar28._4_4_;
          auVar56._0_4_ = auVar104._0_4_ * auVar28._0_4_;
          auVar56._8_4_ = auVar104._8_4_ * auVar28._8_4_;
          auVar56._12_4_ = auVar104._12_4_ * auVar28._12_4_;
          auVar56._16_4_ = auVar104._16_4_ * 0.0;
          auVar56._20_4_ = auVar104._20_4_ * 0.0;
          auVar56._24_4_ = auVar104._24_4_ * 0.0;
          auVar56._28_4_ = auVar102._28_4_;
          auVar81 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar83),auVar105);
          auVar57._4_4_ = auVar105._4_4_ * auVar21._4_4_;
          auVar57._0_4_ = auVar105._0_4_ * auVar21._0_4_;
          auVar57._8_4_ = auVar105._8_4_ * auVar21._8_4_;
          auVar57._12_4_ = auVar105._12_4_ * auVar21._12_4_;
          auVar57._16_4_ = auVar105._16_4_ * 0.0;
          auVar57._20_4_ = auVar105._20_4_ * 0.0;
          auVar57._24_4_ = auVar105._24_4_ * 0.0;
          auVar57._28_4_ = auVar105._28_4_;
          auVar18 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar28),auVar90);
          auVar58._4_4_ = auVar83._4_4_ * auVar90._4_4_;
          auVar58._0_4_ = auVar83._0_4_ * auVar90._0_4_;
          auVar58._8_4_ = auVar83._8_4_ * auVar90._8_4_;
          auVar58._12_4_ = auVar83._12_4_ * auVar90._12_4_;
          auVar58._16_4_ = auVar90._16_4_ * 0.0;
          auVar58._20_4_ = auVar90._20_4_ * 0.0;
          auVar58._24_4_ = auVar90._24_4_ * 0.0;
          auVar58._28_4_ = auVar90._28_4_;
          auVar20 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar21),auVar104);
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar101,ZEXT1632(auVar18));
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,ZEXT1632(auVar81));
          auVar98 = ZEXT1632(auVar80);
          uVar67 = vcmpps_avx512vl(auVar104,auVar98,2);
          bVar66 = (byte)uVar67;
          fVar131 = (float)((uint)(bVar66 & 1) * auVar19._0_4_ |
                           (uint)!(bool)(bVar66 & 1) * auVar22._0_4_);
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          fVar133 = (float)((uint)bVar12 * auVar19._4_4_ | (uint)!bVar12 * auVar22._4_4_);
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          fVar136 = (float)((uint)bVar12 * auVar19._8_4_ | (uint)!bVar12 * auVar22._8_4_);
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          fVar137 = (float)((uint)bVar12 * auVar19._12_4_ | (uint)!bVar12 * auVar22._12_4_);
          auVar101 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar136,CONCAT44(fVar133,fVar131))));
          fVar132 = (float)((uint)(bVar66 & 1) * auVar82._0_4_ |
                           (uint)!(bool)(bVar66 & 1) * auVar23._0_4_);
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          fVar135 = (float)((uint)bVar12 * auVar82._4_4_ | (uint)!bVar12 * auVar23._4_4_);
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          fVar134 = (float)((uint)bVar12 * auVar82._8_4_ | (uint)!bVar12 * auVar23._8_4_);
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          fVar138 = (float)((uint)bVar12 * auVar82._12_4_ | (uint)!bVar12 * auVar23._12_4_);
          auVar95 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar134,CONCAT44(fVar135,fVar132))));
          auVar121._0_4_ =
               (float)((uint)(bVar66 & 1) * auVar103._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar29._0_4_);
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar29._4_4_);
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar29._8_4_);
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar29._12_4_)
          ;
          fVar150 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar103._16_4_);
          auVar121._16_4_ = fVar150;
          fVar149 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar103._20_4_);
          auVar121._20_4_ = fVar149;
          fVar161 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar103._24_4_);
          auVar121._24_4_ = fVar161;
          iVar1 = (uint)(byte)(uVar67 >> 7) * auVar103._28_4_;
          auVar121._28_4_ = iVar1;
          auVar104 = vblendmps_avx512vl(ZEXT1632(auVar21),auVar92);
          auVar122._0_4_ =
               (uint)(bVar66 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar81._0_4_;
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar81._4_4_;
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar81._8_4_;
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar81._12_4_;
          auVar122._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar104._16_4_;
          auVar122._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar104._20_4_;
          auVar122._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar104._24_4_;
          auVar122._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar104._28_4_;
          auVar104 = vblendmps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar84));
          auVar123._0_4_ =
               (float)((uint)(bVar66 & 1) * auVar104._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar19._0_4_);
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar19._4_4_);
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar19._8_4_);
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar19._12_4_)
          ;
          fVar175 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar104._16_4_);
          auVar123._16_4_ = fVar175;
          fVar206 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar104._20_4_);
          auVar123._20_4_ = fVar206;
          fVar151 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar104._24_4_);
          auVar123._24_4_ = fVar151;
          auVar123._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar104._28_4_;
          auVar104 = vblendmps_avx512vl(ZEXT1632(auVar28),ZEXT1632(auVar85));
          auVar124._0_4_ =
               (float)((uint)(bVar66 & 1) * auVar104._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar82._0_4_);
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar82._4_4_);
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar82._8_4_);
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar82._12_4_)
          ;
          fVar78 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar104._16_4_);
          auVar124._16_4_ = fVar78;
          fVar79 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar104._20_4_);
          auVar124._20_4_ = fVar79;
          fVar130 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar104._24_4_);
          auVar124._24_4_ = fVar130;
          iVar2 = (uint)(byte)(uVar67 >> 7) * auVar104._28_4_;
          auVar124._28_4_ = iVar2;
          auVar125._0_4_ =
               (uint)(bVar66 & 1) * (int)auVar21._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar92._0_4_;
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar12 * (int)auVar21._4_4_ | (uint)!bVar12 * auVar92._4_4_;
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar12 * (int)auVar21._8_4_ | (uint)!bVar12 * auVar92._8_4_;
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar12 * (int)auVar21._12_4_ | (uint)!bVar12 * auVar92._12_4_;
          auVar125._16_4_ = (uint)!(bool)((byte)(uVar67 >> 4) & 1) * auVar92._16_4_;
          auVar125._20_4_ = (uint)!(bool)((byte)(uVar67 >> 5) & 1) * auVar92._20_4_;
          auVar125._24_4_ = (uint)!(bool)((byte)(uVar67 >> 6) & 1) * auVar92._24_4_;
          auVar125._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar92._28_4_;
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar67 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar67 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar67 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar92 = vsubps_avx512vl(auVar125,auVar101);
          auVar105 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar83._12_4_ |
                                                   (uint)!bVar16 * auVar84._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar83._8_4_ |
                                                            (uint)!bVar14 * auVar84._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar83._4_4_ |
                                                                     (uint)!bVar12 * auVar84._4_4_,
                                                                     (uint)(bVar66 & 1) *
                                                                     (int)auVar83._0_4_ |
                                                                     (uint)!(bool)(bVar66 & 1) *
                                                                     auVar84._0_4_)))),auVar95);
          auVar197 = ZEXT3264(auVar105);
          auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar28._12_4_ |
                                                   (uint)!bVar17 * auVar85._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar28._8_4_ |
                                                            (uint)!bVar15 * auVar85._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar28._4_4_ |
                                                                     (uint)!bVar13 * auVar85._4_4_,
                                                                     (uint)(bVar66 & 1) *
                                                                     (int)auVar28._0_4_ |
                                                                     (uint)!(bool)(bVar66 & 1) *
                                                                     auVar85._0_4_)))),auVar121);
          auVar102 = vsubps_avx(auVar101,auVar122);
          auVar203 = ZEXT3264(auVar102);
          auVar90 = vsubps_avx(auVar95,auVar123);
          auVar91 = vsubps_avx(auVar121,auVar124);
          auVar59._4_4_ = auVar103._4_4_ * fVar133;
          auVar59._0_4_ = auVar103._0_4_ * fVar131;
          auVar59._8_4_ = auVar103._8_4_ * fVar136;
          auVar59._12_4_ = auVar103._12_4_ * fVar137;
          auVar59._16_4_ = auVar103._16_4_ * 0.0;
          auVar59._20_4_ = auVar103._20_4_ * 0.0;
          auVar59._24_4_ = auVar103._24_4_ * 0.0;
          auVar59._28_4_ = 0;
          auVar84 = vfmsub231ps_fma(auVar59,auVar121,auVar92);
          auVar182._0_4_ = fVar132 * auVar92._0_4_;
          auVar182._4_4_ = fVar135 * auVar92._4_4_;
          auVar182._8_4_ = fVar134 * auVar92._8_4_;
          auVar182._12_4_ = fVar138 * auVar92._12_4_;
          auVar182._16_4_ = auVar92._16_4_ * 0.0;
          auVar182._20_4_ = auVar92._20_4_ * 0.0;
          auVar182._24_4_ = auVar92._24_4_ * 0.0;
          auVar182._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar182,auVar101,auVar105);
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar98,ZEXT1632(auVar84));
          auVar188._0_4_ = auVar105._0_4_ * auVar121._0_4_;
          auVar188._4_4_ = auVar105._4_4_ * auVar121._4_4_;
          auVar188._8_4_ = auVar105._8_4_ * auVar121._8_4_;
          auVar188._12_4_ = auVar105._12_4_ * auVar121._12_4_;
          auVar188._16_4_ = auVar105._16_4_ * fVar150;
          auVar188._20_4_ = auVar105._20_4_ * fVar149;
          auVar188._24_4_ = auVar105._24_4_ * fVar161;
          auVar188._28_4_ = 0;
          auVar84 = vfmsub231ps_fma(auVar188,auVar95,auVar103);
          auVar96 = vfmadd231ps_avx512vl(auVar104,auVar98,ZEXT1632(auVar84));
          auVar104 = vmulps_avx512vl(auVar91,auVar122);
          auVar104 = vfmsub231ps_avx512vl(auVar104,auVar102,auVar124);
          auVar60._4_4_ = auVar90._4_4_ * auVar124._4_4_;
          auVar60._0_4_ = auVar90._0_4_ * auVar124._0_4_;
          auVar60._8_4_ = auVar90._8_4_ * auVar124._8_4_;
          auVar60._12_4_ = auVar90._12_4_ * auVar124._12_4_;
          auVar60._16_4_ = auVar90._16_4_ * fVar78;
          auVar60._20_4_ = auVar90._20_4_ * fVar79;
          auVar60._24_4_ = auVar90._24_4_ * fVar130;
          auVar60._28_4_ = iVar2;
          auVar84 = vfmsub231ps_fma(auVar60,auVar123,auVar91);
          auVar189._0_4_ = auVar123._0_4_ * auVar102._0_4_;
          auVar189._4_4_ = auVar123._4_4_ * auVar102._4_4_;
          auVar189._8_4_ = auVar123._8_4_ * auVar102._8_4_;
          auVar189._12_4_ = auVar123._12_4_ * auVar102._12_4_;
          auVar189._16_4_ = fVar175 * auVar102._16_4_;
          auVar189._20_4_ = fVar206 * auVar102._20_4_;
          auVar189._24_4_ = fVar151 * auVar102._24_4_;
          auVar189._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar189,auVar90,auVar122);
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar98,auVar104);
          auVar97 = vfmadd231ps_avx512vl(auVar104,auVar98,ZEXT1632(auVar84));
          auVar190 = ZEXT3264(auVar97);
          auVar104 = vmaxps_avx(auVar96,auVar97);
          uVar152 = vcmpps_avx512vl(auVar104,auVar98,2);
          bVar76 = bVar76 & (byte)uVar152;
          if (bVar76 != 0) {
            auVar61._4_4_ = auVar91._4_4_ * auVar105._4_4_;
            auVar61._0_4_ = auVar91._0_4_ * auVar105._0_4_;
            auVar61._8_4_ = auVar91._8_4_ * auVar105._8_4_;
            auVar61._12_4_ = auVar91._12_4_ * auVar105._12_4_;
            auVar61._16_4_ = auVar91._16_4_ * auVar105._16_4_;
            auVar61._20_4_ = auVar91._20_4_ * auVar105._20_4_;
            auVar61._24_4_ = auVar91._24_4_ * auVar105._24_4_;
            auVar61._28_4_ = auVar104._28_4_;
            auVar18 = vfmsub231ps_fma(auVar61,auVar90,auVar103);
            auVar62._4_4_ = auVar103._4_4_ * auVar102._4_4_;
            auVar62._0_4_ = auVar103._0_4_ * auVar102._0_4_;
            auVar62._8_4_ = auVar103._8_4_ * auVar102._8_4_;
            auVar62._12_4_ = auVar103._12_4_ * auVar102._12_4_;
            auVar62._16_4_ = auVar103._16_4_ * auVar102._16_4_;
            auVar62._20_4_ = auVar103._20_4_ * auVar102._20_4_;
            auVar62._24_4_ = auVar103._24_4_ * auVar102._24_4_;
            auVar62._28_4_ = auVar103._28_4_;
            auVar81 = vfmsub231ps_fma(auVar62,auVar92,auVar91);
            auVar63._4_4_ = auVar90._4_4_ * auVar92._4_4_;
            auVar63._0_4_ = auVar90._0_4_ * auVar92._0_4_;
            auVar63._8_4_ = auVar90._8_4_ * auVar92._8_4_;
            auVar63._12_4_ = auVar90._12_4_ * auVar92._12_4_;
            auVar63._16_4_ = auVar90._16_4_ * auVar92._16_4_;
            auVar63._20_4_ = auVar90._20_4_ * auVar92._20_4_;
            auVar63._24_4_ = auVar90._24_4_ * auVar92._24_4_;
            auVar63._28_4_ = auVar90._28_4_;
            auVar19 = vfmsub231ps_fma(auVar63,auVar102,auVar105);
            auVar84 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar19));
            auVar85 = vfmadd231ps_fma(ZEXT1632(auVar84),ZEXT1632(auVar18),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar104 = vrcp14ps_avx512vl(ZEXT1632(auVar85));
            auVar35._8_4_ = 0x3f800000;
            auVar35._0_8_ = 0x3f8000003f800000;
            auVar35._12_4_ = 0x3f800000;
            auVar35._16_4_ = 0x3f800000;
            auVar35._20_4_ = 0x3f800000;
            auVar35._24_4_ = 0x3f800000;
            auVar35._28_4_ = 0x3f800000;
            auVar105 = vfnmadd213ps_avx512vl(auVar104,ZEXT1632(auVar85),auVar35);
            auVar84 = vfmadd132ps_fma(auVar105,auVar104,auVar104);
            auVar197 = ZEXT1664(auVar84);
            auVar64._4_4_ = auVar19._4_4_ * auVar121._4_4_;
            auVar64._0_4_ = auVar19._0_4_ * auVar121._0_4_;
            auVar64._8_4_ = auVar19._8_4_ * auVar121._8_4_;
            auVar64._12_4_ = auVar19._12_4_ * auVar121._12_4_;
            auVar64._16_4_ = fVar150 * 0.0;
            auVar64._20_4_ = fVar149 * 0.0;
            auVar64._24_4_ = fVar161 * 0.0;
            auVar64._28_4_ = iVar1;
            auVar81 = vfmadd231ps_fma(auVar64,auVar95,ZEXT1632(auVar81));
            auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar101,ZEXT1632(auVar18));
            fVar149 = auVar84._0_4_;
            fVar150 = auVar84._4_4_;
            fVar151 = auVar84._8_4_;
            fVar206 = auVar84._12_4_;
            local_280._28_4_ = auVar104._28_4_;
            local_280._0_28_ =
                 ZEXT1628(CONCAT412(auVar81._12_4_ * fVar206,
                                    CONCAT48(auVar81._8_4_ * fVar151,
                                             CONCAT44(auVar81._4_4_ * fVar150,
                                                      auVar81._0_4_ * fVar149))));
            auVar203 = ZEXT3264(local_280);
            uVar152 = vcmpps_avx512vl(local_280,local_3e0,0xd);
            fVar161 = (ray->super_RayK<1>).tfar;
            auVar36._4_4_ = fVar161;
            auVar36._0_4_ = fVar161;
            auVar36._8_4_ = fVar161;
            auVar36._12_4_ = fVar161;
            auVar36._16_4_ = fVar161;
            auVar36._20_4_ = fVar161;
            auVar36._24_4_ = fVar161;
            auVar36._28_4_ = fVar161;
            uVar24 = vcmpps_avx512vl(local_280,auVar36,2);
            bVar76 = (byte)uVar152 & (byte)uVar24 & bVar76;
            if (bVar76 != 0) {
              uVar77 = vcmpps_avx512vl(ZEXT1632(auVar85),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar77 = bVar76 & uVar77;
              if ((char)uVar77 != '\0') {
                fVar161 = auVar96._0_4_ * fVar149;
                fVar175 = auVar96._4_4_ * fVar150;
                auVar65._4_4_ = fVar175;
                auVar65._0_4_ = fVar161;
                fVar78 = auVar96._8_4_ * fVar151;
                auVar65._8_4_ = fVar78;
                fVar79 = auVar96._12_4_ * fVar206;
                auVar65._12_4_ = fVar79;
                fVar130 = auVar96._16_4_ * 0.0;
                auVar65._16_4_ = fVar130;
                fVar131 = auVar96._20_4_ * 0.0;
                auVar65._20_4_ = fVar131;
                fVar132 = auVar96._24_4_ * 0.0;
                auVar65._24_4_ = fVar132;
                auVar65._28_4_ = auVar96._28_4_;
                auVar174._8_4_ = 0x3f800000;
                auVar174._0_8_ = 0x3f8000003f800000;
                auVar174._12_4_ = 0x3f800000;
                auVar174._16_4_ = 0x3f800000;
                auVar174._20_4_ = 0x3f800000;
                auVar174._24_4_ = 0x3f800000;
                auVar174._28_4_ = 0x3f800000;
                auVar104 = vsubps_avx(auVar174,auVar65);
                local_2c0._0_4_ =
                     (float)((uint)(bVar66 & 1) * (int)fVar161 |
                            (uint)!(bool)(bVar66 & 1) * auVar104._0_4_);
                bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar12 * (int)fVar175 | (uint)!bVar12 * auVar104._4_4_);
                bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar12 * (int)fVar78 | (uint)!bVar12 * auVar104._8_4_);
                bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar12 * (int)fVar79 | (uint)!bVar12 * auVar104._12_4_);
                bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar12 * (int)fVar130 | (uint)!bVar12 * auVar104._16_4_);
                bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar12 * (int)fVar131 | (uint)!bVar12 * auVar104._20_4_);
                bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar12 * (int)fVar132 | (uint)!bVar12 * auVar104._24_4_);
                bVar12 = SUB81(uVar67 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar12 * auVar96._28_4_ | (uint)!bVar12 * auVar104._28_4_);
                auVar104 = vsubps_avx(auVar94,auVar93);
                auVar84 = vfmadd213ps_fma(auVar104,local_2c0,auVar93);
                fVar161 = local_518->depth_scale;
                auVar37._4_4_ = fVar161;
                auVar37._0_4_ = fVar161;
                auVar37._8_4_ = fVar161;
                auVar37._12_4_ = fVar161;
                auVar37._16_4_ = fVar161;
                auVar37._20_4_ = fVar161;
                auVar37._24_4_ = fVar161;
                auVar37._28_4_ = fVar161;
                auVar104 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar84._12_4_ + auVar84._12_4_,
                                                              CONCAT48(auVar84._8_4_ + auVar84._8_4_
                                                                       ,CONCAT44(auVar84._4_4_ +
                                                                                 auVar84._4_4_,
                                                                                 auVar84._0_4_ +
                                                                                 auVar84._0_4_)))),
                                           auVar37);
                uVar25 = vcmpps_avx512vl(local_280,auVar104,6);
                uVar77 = uVar77 & uVar25;
                bVar76 = (byte)uVar77;
                if (bVar76 != 0) {
                  auVar160._0_4_ = auVar97._0_4_ * fVar149;
                  auVar160._4_4_ = auVar97._4_4_ * fVar150;
                  auVar160._8_4_ = auVar97._8_4_ * fVar151;
                  auVar160._12_4_ = auVar97._12_4_ * fVar206;
                  auVar160._16_4_ = auVar97._16_4_ * 0.0;
                  auVar160._20_4_ = auVar97._20_4_ * 0.0;
                  auVar160._24_4_ = auVar97._24_4_ * 0.0;
                  auVar160._28_4_ = 0;
                  auVar183._8_4_ = 0x3f800000;
                  auVar183._0_8_ = 0x3f8000003f800000;
                  auVar183._12_4_ = 0x3f800000;
                  auVar183._16_4_ = 0x3f800000;
                  auVar183._20_4_ = 0x3f800000;
                  auVar183._24_4_ = 0x3f800000;
                  auVar183._28_4_ = 0x3f800000;
                  auVar104 = vsubps_avx(auVar183,auVar160);
                  auVar126._0_4_ =
                       (uint)(bVar66 & 1) * (int)auVar160._0_4_ |
                       (uint)!(bool)(bVar66 & 1) * auVar104._0_4_;
                  bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
                  auVar126._4_4_ =
                       (uint)bVar12 * (int)auVar160._4_4_ | (uint)!bVar12 * auVar104._4_4_;
                  bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
                  auVar126._8_4_ =
                       (uint)bVar12 * (int)auVar160._8_4_ | (uint)!bVar12 * auVar104._8_4_;
                  bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
                  auVar126._12_4_ =
                       (uint)bVar12 * (int)auVar160._12_4_ | (uint)!bVar12 * auVar104._12_4_;
                  bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
                  auVar126._16_4_ =
                       (uint)bVar12 * (int)auVar160._16_4_ | (uint)!bVar12 * auVar104._16_4_;
                  bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
                  auVar126._20_4_ =
                       (uint)bVar12 * (int)auVar160._20_4_ | (uint)!bVar12 * auVar104._20_4_;
                  bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
                  auVar126._24_4_ =
                       (uint)bVar12 * (int)auVar160._24_4_ | (uint)!bVar12 * auVar104._24_4_;
                  auVar126._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar104._28_4_;
                  auVar38._8_4_ = 0x40000000;
                  auVar38._0_8_ = 0x4000000040000000;
                  auVar38._12_4_ = 0x40000000;
                  auVar38._16_4_ = 0x40000000;
                  auVar38._20_4_ = 0x40000000;
                  auVar38._24_4_ = 0x40000000;
                  auVar38._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar126,auVar183,auVar38);
                  local_260 = (int)lVar72;
                  local_25c = iVar8;
                  local_250 = local_4b0._0_8_;
                  uStack_248 = local_4b0._8_8_;
                  local_240 = local_4c0._0_8_;
                  uStack_238 = local_4c0._8_8_;
                  local_230 = local_4d0._0_8_;
                  uStack_228 = local_4d0._8_8_;
                  local_220 = local_4e0;
                  uStack_218 = uStack_4d8;
                  pGVar70 = (context->scene->geometries).items[local_530].ptr;
                  if ((pGVar70->mask & (ray->super_RayK<1>).mask) != 0) {
                    uVar73 = (uint)uVar77;
                    auVar84 = vcvtsi2ss_avx512f(auVar80,(int)lVar72);
                    fVar161 = auVar84._0_4_;
                    local_200[0] = (fVar161 + local_2c0._0_4_ + 0.0) * local_100;
                    local_200[1] = (fVar161 + local_2c0._4_4_ + 1.0) * fStack_fc;
                    local_200[2] = (fVar161 + local_2c0._8_4_ + 2.0) * fStack_f8;
                    local_200[3] = (fVar161 + local_2c0._12_4_ + 3.0) * fStack_f4;
                    fStack_1f0 = (fVar161 + local_2c0._16_4_ + 4.0) * fStack_f0;
                    fStack_1ec = (fVar161 + local_2c0._20_4_ + 5.0) * fStack_ec;
                    fStack_1e8 = (fVar161 + local_2c0._24_4_ + 6.0) * fStack_e8;
                    fStack_1e4 = fVar161 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_280;
                    auVar146._8_4_ = 0x7f800000;
                    auVar146._0_8_ = 0x7f8000007f800000;
                    auVar146._12_4_ = 0x7f800000;
                    auVar146._16_4_ = 0x7f800000;
                    auVar146._20_4_ = 0x7f800000;
                    auVar146._24_4_ = 0x7f800000;
                    auVar146._28_4_ = 0x7f800000;
                    auVar104 = vblendmps_avx512vl(auVar146,local_280);
                    auVar127._0_4_ =
                         (uint)(bVar76 & 1) * auVar104._0_4_ |
                         (uint)!(bool)(bVar76 & 1) * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
                    auVar127._4_4_ = (uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
                    auVar127._8_4_ = (uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
                    auVar127._12_4_ = (uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar77 >> 4) & 1);
                    auVar127._16_4_ = (uint)bVar12 * auVar104._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar77 >> 5) & 1);
                    auVar127._20_4_ = (uint)bVar12 * auVar104._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar77 >> 6) & 1);
                    auVar127._24_4_ = (uint)bVar12 * auVar104._24_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = SUB81(uVar77 >> 7,0);
                    auVar127._28_4_ = (uint)bVar12 * auVar104._28_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar104 = vshufps_avx(auVar127,auVar127,0xb1);
                    auVar104 = vminps_avx(auVar127,auVar104);
                    auVar105 = vshufpd_avx(auVar104,auVar104,5);
                    auVar104 = vminps_avx(auVar104,auVar105);
                    auVar105 = vpermpd_avx2(auVar104,0x4e);
                    auVar104 = vminps_avx(auVar104,auVar105);
                    uVar152 = vcmpps_avx512vl(auVar127,auVar104,0);
                    if (((byte)uVar152 & bVar76) != 0) {
                      uVar73 = (uint)((byte)uVar152 & bVar76);
                    }
                    uVar69 = 0;
                    for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                      uVar69 = uVar69 + 1;
                    }
                    uVar67 = (ulong)uVar69;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar70->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_440 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                      local_460 = local_280;
                      local_468 = pGVar70;
                      do {
                        local_494 = local_200[uVar67];
                        local_490 = *(undefined4 *)(local_1e0 + uVar67 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar67 * 4);
                        local_510.context = context->user;
                        fVar149 = 1.0 - local_494;
                        fVar161 = fVar149 * fVar149 * -3.0;
                        auVar190 = ZEXT464((uint)fVar161);
                        auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar149 * fVar149)),
                                                  ZEXT416((uint)(local_494 * fVar149)),
                                                  ZEXT416(0xc0000000));
                        auVar85 = vfmsub132ss_fma(ZEXT416((uint)(local_494 * fVar149)),
                                                  ZEXT416((uint)(local_494 * local_494)),
                                                  ZEXT416(0x40000000));
                        fVar149 = auVar84._0_4_ * 3.0;
                        fVar150 = auVar85._0_4_ * 3.0;
                        fVar151 = local_494 * local_494 * 3.0;
                        auVar195._0_4_ = fVar151 * (float)local_4e0._0_4_;
                        auVar195._4_4_ = fVar151 * (float)local_4e0._4_4_;
                        auVar195._8_4_ = fVar151 * (float)uStack_4d8;
                        auVar195._12_4_ = fVar151 * uStack_4d8._4_4_;
                        auVar197 = ZEXT1664(auVar195);
                        auVar169._4_4_ = fVar150;
                        auVar169._0_4_ = fVar150;
                        auVar169._8_4_ = fVar150;
                        auVar169._12_4_ = fVar150;
                        auVar84 = vfmadd132ps_fma(auVar169,auVar195,local_4d0);
                        auVar179._4_4_ = fVar149;
                        auVar179._0_4_ = fVar149;
                        auVar179._8_4_ = fVar149;
                        auVar179._12_4_ = fVar149;
                        auVar84 = vfmadd132ps_fma(auVar179,auVar84,local_4c0);
                        auVar170._4_4_ = fVar161;
                        auVar170._0_4_ = fVar161;
                        auVar170._8_4_ = fVar161;
                        auVar170._12_4_ = fVar161;
                        auVar84 = vfmadd132ps_fma(auVar170,auVar84,local_4b0);
                        local_4a0 = vmovlps_avx(auVar84);
                        local_498 = vextractps_avx(auVar84,2);
                        local_48c = (int)local_528;
                        local_488 = (int)local_530;
                        local_484 = (local_510.context)->instID[0];
                        local_480 = (local_510.context)->instPrimID[0];
                        local_53c = -1;
                        local_510.valid = &local_53c;
                        local_510.geometryUserPtr = pGVar70->userPtr;
                        local_510.ray = (RTCRayN *)ray;
                        local_510.hit = (RTCHitN *)&local_4a0;
                        local_510.N = 1;
                        if (pGVar70->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b78cce:
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar70->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar190 = ZEXT1664(auVar190._0_16_);
                            auVar197 = ZEXT1664(auVar197._0_16_);
                            (*p_Var11)(&local_510);
                            auVar203 = ZEXT3264(local_460);
                            context = local_538;
                            pGVar70 = local_468;
                            if (*local_510.valid == 0) goto LAB_01b78d70;
                          }
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).components[0] =
                               *(float *)local_510.hit;
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_510.hit + 4);
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_510.hit + 8);
                          *(float *)((long)local_510.ray + 0x3c) = *(float *)(local_510.hit + 0xc);
                          *(float *)((long)local_510.ray + 0x40) = *(float *)(local_510.hit + 0x10);
                          *(float *)((long)local_510.ray + 0x44) = *(float *)(local_510.hit + 0x14);
                          *(float *)((long)local_510.ray + 0x48) = *(float *)(local_510.hit + 0x18);
                          *(float *)((long)local_510.ray + 0x4c) = *(float *)(local_510.hit + 0x1c);
                          *(float *)((long)local_510.ray + 0x50) = *(float *)(local_510.hit + 0x20);
                        }
                        else {
                          auVar190 = ZEXT464((uint)fVar161);
                          auVar197 = ZEXT1664(auVar195);
                          (*pGVar70->intersectionFilterN)(&local_510);
                          auVar203 = ZEXT3264(local_460);
                          context = local_538;
                          pGVar70 = local_468;
                          if (*local_510.valid != 0) goto LAB_01b78cce;
LAB_01b78d70:
                          (ray->super_RayK<1>).tfar = (float)local_440._0_4_;
                          context = local_538;
                          pGVar70 = local_468;
                        }
                        bVar76 = ~(byte)(1 << ((uint)uVar67 & 0x1f)) & (byte)uVar77;
                        fVar161 = (ray->super_RayK<1>).tfar;
                        auVar39._4_4_ = fVar161;
                        auVar39._0_4_ = fVar161;
                        auVar39._8_4_ = fVar161;
                        auVar39._12_4_ = fVar161;
                        auVar39._16_4_ = fVar161;
                        auVar39._20_4_ = fVar161;
                        auVar39._24_4_ = fVar161;
                        auVar39._28_4_ = fVar161;
                        uVar152 = vcmpps_avx512vl(auVar203._0_32_,auVar39,2);
                        if ((bVar76 & (byte)uVar152) == 0) goto LAB_01b78e13;
                        local_440 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar76 = bVar76 & (byte)uVar152;
                        uVar73 = (uint)bVar76;
                        uVar77 = (ulong)uVar73;
                        auVar147._8_4_ = 0x7f800000;
                        auVar147._0_8_ = 0x7f8000007f800000;
                        auVar147._12_4_ = 0x7f800000;
                        auVar147._16_4_ = 0x7f800000;
                        auVar147._20_4_ = 0x7f800000;
                        auVar147._24_4_ = 0x7f800000;
                        auVar147._28_4_ = 0x7f800000;
                        auVar104 = vblendmps_avx512vl(auVar147,auVar203._0_32_);
                        auVar128._0_4_ =
                             (uint)(bVar76 & 1) * auVar104._0_4_ |
                             (uint)!(bool)(bVar76 & 1) * 0x7f800000;
                        bVar12 = (bool)(bVar76 >> 1 & 1);
                        auVar128._4_4_ = (uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar76 >> 2 & 1);
                        auVar128._8_4_ = (uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar76 >> 3 & 1);
                        auVar128._12_4_ =
                             (uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar76 >> 4 & 1);
                        auVar128._16_4_ =
                             (uint)bVar12 * auVar104._16_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar76 >> 5 & 1);
                        auVar128._20_4_ =
                             (uint)bVar12 * auVar104._20_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar76 >> 6 & 1);
                        auVar128._24_4_ =
                             (uint)bVar12 * auVar104._24_4_ | (uint)!bVar12 * 0x7f800000;
                        auVar128._28_4_ =
                             (uint)(bVar76 >> 7) * auVar104._28_4_ |
                             (uint)!(bool)(bVar76 >> 7) * 0x7f800000;
                        auVar104 = vshufps_avx(auVar128,auVar128,0xb1);
                        auVar104 = vminps_avx(auVar128,auVar104);
                        auVar105 = vshufpd_avx(auVar104,auVar104,5);
                        auVar104 = vminps_avx(auVar104,auVar105);
                        auVar105 = vpermpd_avx2(auVar104,0x4e);
                        auVar104 = vminps_avx(auVar104,auVar105);
                        uVar152 = vcmpps_avx512vl(auVar128,auVar104,0);
                        bVar76 = (byte)uVar152 & bVar76;
                        if (bVar76 != 0) {
                          uVar73 = (uint)bVar76;
                        }
                        uVar69 = 0;
                        for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                          uVar69 = uVar69 + 1;
                        }
                        uVar67 = (ulong)uVar69;
                      } while( true );
                    }
                    fVar161 = local_200[uVar67];
                    fVar149 = *(float *)(local_1e0 + uVar67 * 4);
                    fVar151 = 1.0 - fVar161;
                    fVar150 = fVar151 * fVar151 * -3.0;
                    auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151)),
                                              ZEXT416((uint)(fVar161 * fVar151)),ZEXT416(0xc0000000)
                                             );
                    auVar85 = vfmsub132ss_fma(ZEXT416((uint)(fVar161 * fVar151)),
                                              ZEXT416((uint)(fVar161 * fVar161)),ZEXT416(0x40000000)
                                             );
                    fVar151 = auVar84._0_4_ * 3.0;
                    fVar206 = auVar85._0_4_ * 3.0;
                    fVar175 = fVar161 * fVar161 * 3.0;
                    auVar194._0_4_ = fVar175 * (float)local_4e0._0_4_;
                    auVar194._4_4_ = fVar175 * (float)local_4e0._4_4_;
                    auVar194._8_4_ = fVar175 * (float)uStack_4d8;
                    auVar194._12_4_ = fVar175 * uStack_4d8._4_4_;
                    auVar197 = ZEXT1664(auVar194);
                    auVar167._4_4_ = fVar206;
                    auVar167._0_4_ = fVar206;
                    auVar167._8_4_ = fVar206;
                    auVar167._12_4_ = fVar206;
                    auVar84 = vfmadd132ps_fma(auVar167,auVar194,local_4d0);
                    auVar178._4_4_ = fVar151;
                    auVar178._0_4_ = fVar151;
                    auVar178._8_4_ = fVar151;
                    auVar178._12_4_ = fVar151;
                    auVar84 = vfmadd132ps_fma(auVar178,auVar84,local_4c0);
                    auVar168._4_4_ = fVar150;
                    auVar168._0_4_ = fVar150;
                    auVar168._8_4_ = fVar150;
                    auVar168._12_4_ = fVar150;
                    auVar190 = ZEXT464((uint)*(float *)(local_1c0 + uVar67 * 4));
                    (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar67 * 4);
                    auVar84 = vfmadd132ps_fma(auVar168,auVar84,local_4b0);
                    uVar152 = vmovlps_avx(auVar84);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar152;
                    fVar150 = (float)vextractps_avx(auVar84,2);
                    (ray->Ng).field_0.field_0.z = fVar150;
                    ray->u = fVar161;
                    ray->v = fVar149;
                    ray->primID = (uint)local_528;
                    ray->geomID = (uint)local_530;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01b78b2d;
      }
LAB_01b781e5:
      fVar161 = (ray->super_RayK<1>).tfar;
      auVar31._4_4_ = fVar161;
      auVar31._0_4_ = fVar161;
      auVar31._8_4_ = fVar161;
      auVar31._12_4_ = fVar161;
      uVar152 = vcmpps_avx512vl(local_190,auVar31,2);
      uVar73 = (uint)uVar75 & (uint)uVar75 + 0xf & (uint)uVar152;
      uVar75 = (ulong)uVar73;
    } while (uVar73 != 0);
  }
  return;
LAB_01b78e13:
  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar218 = ZEXT1664(auVar84);
  auVar219 = ZEXT464(0xbf800000);
  prim = local_520;
LAB_01b78b2d:
  lVar72 = lVar72 + 8;
  if (iVar8 <= (int)lVar72) goto LAB_01b781e5;
  goto LAB_01b78277;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }